

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx::CurveNiMBIntersector1<4>::
     occluded_n<embree::avx::OrientedCurve1Intersector1<embree::BezierCurveT,7,8>,embree::avx::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar10;
  Primitive PVar11;
  Geometry *pGVar12;
  __int_type_conflict _Var13;
  long lVar14;
  long lVar15;
  long lVar16;
  RTCFilterFunctionN p_Var17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  byte bVar64;
  uint uVar65;
  ulong uVar66;
  long lVar67;
  uint uVar68;
  long lVar70;
  bool bVar71;
  uint uVar72;
  undefined1 auVar73 [8];
  ulong uVar74;
  float fVar75;
  float fVar114;
  float fVar115;
  vint4 bi_1;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar116;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar108 [32];
  undefined1 auVar92 [16];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  vint4 bi;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar127 [16];
  undefined1 auVar146 [32];
  undefined1 auVar128 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  float fVar150;
  float fVar180;
  float fVar181;
  vint4 bi_2;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  float fVar182;
  float fVar196;
  float fVar197;
  vint4 ai_1;
  undefined1 auVar183 [16];
  float fVar198;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [32];
  float fVar199;
  float fVar224;
  float fVar225;
  vint4 ai_2;
  undefined1 auVar200 [16];
  float fVar226;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  float fVar227;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  float fVar228;
  float fVar246;
  float fVar247;
  undefined1 auVar229 [16];
  float fVar248;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar257 [16];
  vint4 ai;
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [32];
  float fVar270;
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar283 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [32];
  float fVar288;
  float fVar298;
  float fVar299;
  undefined1 auVar289 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  float fVar300;
  undefined1 auVar290 [16];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar303 [16];
  undefined1 auVar306 [32];
  float fVar307;
  float fVar308;
  float fVar315;
  float fVar317;
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  float fVar316;
  float fVar318;
  float fVar319;
  float fVar320;
  undefined1 auVar314 [32];
  float fVar321;
  float fVar326;
  float fVar327;
  undefined1 auVar322 [16];
  float fVar328;
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  float fVar329;
  float fVar334;
  float fVar335;
  undefined1 auVar330 [16];
  float fVar336;
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  vfloat4 a0;
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  float fVar345;
  float fVar347;
  float fVar348;
  undefined1 auVar346 [16];
  float fVar349;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_4e8 [8];
  float fStack_4e0;
  float fStack_4dc;
  undefined1 local_4d8 [8];
  float fStack_4d0;
  float fStack_4cc;
  int local_4bc;
  undefined1 local_4b8 [8];
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  float fStack_4a0;
  undefined1 local_498 [8];
  float fStack_490;
  float fStack_48c;
  undefined1 local_488 [8];
  float fStack_480;
  float fStack_47c;
  undefined1 auStack_478 [16];
  undefined1 local_468 [8];
  float fStack_460;
  float fStack_45c;
  undefined1 local_458 [8];
  float fStack_450;
  float fStack_44c;
  undefined1 local_448 [8];
  float fStack_440;
  float fStack_43c;
  ulong local_430;
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  float fStack_400;
  undefined1 local_3f8 [8];
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [8];
  float fStack_3b0;
  float fStack_3ac;
  undefined1 local_3a8 [8];
  float fStack_3a0;
  float fStack_39c;
  undefined1 local_398 [8];
  float fStack_390;
  float fStack_38c;
  undefined1 local_388 [8];
  float fStack_380;
  float fStack_37c;
  undefined1 local_378 [8];
  float fStack_370;
  float fStack_36c;
  undefined1 local_368 [8];
  float fStack_360;
  float fStack_35c;
  undefined1 local_358 [8];
  float fStack_350;
  float fStack_34c;
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [8];
  float fStack_330;
  float fStack_32c;
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  undefined1 local_308 [8];
  float fStack_300;
  float fStack_2fc;
  undefined1 auStack_2f8 [16];
  ulong local_2e8;
  Primitive *local_2e0;
  RTCFilterFunctionNArguments local_2d8;
  undefined1 local_2a8 [16];
  undefined1 local_298 [8];
  float fStack_290;
  float fStack_28c;
  uint auStack_288 [4];
  undefined8 local_278;
  undefined4 local_270;
  undefined8 local_26c;
  undefined4 local_264;
  undefined4 local_260;
  uint local_25c;
  uint local_258;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [8];
  float fStack_1c0;
  float fStack_1bc;
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  float afStack_178 [8];
  undefined1 local_158 [32];
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar69;
  undefined1 auVar256 [32];
  undefined1 auVar344 [32];
  
  PVar11 = prim[1];
  uVar66 = (ulong)(byte)PVar11;
  lVar67 = uVar66 * 0x25;
  fVar270 = *(float *)(prim + lVar67 + 0x12);
  auVar96 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + lVar67 + 6));
  auVar117._0_4_ = fVar270 * auVar96._0_4_;
  auVar117._4_4_ = fVar270 * auVar96._4_4_;
  auVar117._8_4_ = fVar270 * auVar96._8_4_;
  auVar117._12_4_ = fVar270 * auVar96._12_4_;
  auVar258._0_4_ = fVar270 * (ray->dir).field_0.m128[0];
  auVar258._4_4_ = fVar270 * (ray->dir).field_0.m128[1];
  auVar258._8_4_ = fVar270 * (ray->dir).field_0.m128[2];
  auVar258._12_4_ = fVar270 * (ray->dir).field_0.m128[3];
  auVar96 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 4 + 6)));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar190 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 5 + 6)));
  auVar190 = vcvtdq2ps_avx(auVar190);
  auVar176 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 6 + 6)));
  auVar176 = vcvtdq2ps_avx(auVar176);
  auVar141 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0xf + 6)));
  auVar130 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar11 * 0x10 + 6)));
  auVar141 = vcvtdq2ps_avx(auVar141);
  auVar166 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar11 * 0x10 + uVar66 + 6)));
  auVar130 = vcvtdq2ps_avx(auVar130);
  auVar166 = vcvtdq2ps_avx(auVar166);
  auVar131 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0x1a + 6)));
  auVar131 = vcvtdq2ps_avx(auVar131);
  auVar257 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0x1b + 6)));
  auVar257 = vcvtdq2ps_avx(auVar257);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0x1c + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vshufps_avx(auVar258,auVar258,0);
  auVar279 = vshufps_avx(auVar258,auVar258,0x55);
  auVar20 = vshufps_avx(auVar258,auVar258,0xaa);
  fVar270 = auVar20._0_4_;
  fVar150 = auVar20._4_4_;
  fVar180 = auVar20._8_4_;
  fVar181 = auVar20._12_4_;
  fVar199 = auVar279._0_4_;
  fVar224 = auVar279._4_4_;
  fVar225 = auVar279._8_4_;
  fVar226 = auVar279._12_4_;
  fVar182 = auVar19._0_4_;
  fVar196 = auVar19._4_4_;
  fVar197 = auVar19._8_4_;
  fVar198 = auVar19._12_4_;
  auVar322._0_4_ = fVar182 * auVar96._0_4_ + fVar199 * auVar190._0_4_ + fVar270 * auVar176._0_4_;
  auVar322._4_4_ = fVar196 * auVar96._4_4_ + fVar224 * auVar190._4_4_ + fVar150 * auVar176._4_4_;
  auVar322._8_4_ = fVar197 * auVar96._8_4_ + fVar225 * auVar190._8_4_ + fVar180 * auVar176._8_4_;
  auVar322._12_4_ = fVar198 * auVar96._12_4_ + fVar226 * auVar190._12_4_ + fVar181 * auVar176._12_4_
  ;
  auVar330._0_4_ = fVar182 * auVar141._0_4_ + fVar199 * auVar130._0_4_ + auVar166._0_4_ * fVar270;
  auVar330._4_4_ = fVar196 * auVar141._4_4_ + fVar224 * auVar130._4_4_ + auVar166._4_4_ * fVar150;
  auVar330._8_4_ = fVar197 * auVar141._8_4_ + fVar225 * auVar130._8_4_ + auVar166._8_4_ * fVar180;
  auVar330._12_4_ =
       fVar198 * auVar141._12_4_ + fVar226 * auVar130._12_4_ + auVar166._12_4_ * fVar181;
  auVar259._0_4_ = fVar182 * auVar131._0_4_ + fVar199 * auVar257._0_4_ + auVar18._0_4_ * fVar270;
  auVar259._4_4_ = fVar196 * auVar131._4_4_ + fVar224 * auVar257._4_4_ + auVar18._4_4_ * fVar150;
  auVar259._8_4_ = fVar197 * auVar131._8_4_ + fVar225 * auVar257._8_4_ + auVar18._8_4_ * fVar180;
  auVar259._12_4_ = fVar198 * auVar131._12_4_ + fVar226 * auVar257._12_4_ + auVar18._12_4_ * fVar181
  ;
  auVar19 = vshufps_avx(auVar117,auVar117,0);
  auVar279 = vshufps_avx(auVar117,auVar117,0x55);
  auVar20 = vshufps_avx(auVar117,auVar117,0xaa);
  fVar270 = auVar20._0_4_;
  fVar150 = auVar20._4_4_;
  fVar180 = auVar20._8_4_;
  fVar181 = auVar20._12_4_;
  fVar199 = auVar279._0_4_;
  fVar224 = auVar279._4_4_;
  fVar225 = auVar279._8_4_;
  fVar226 = auVar279._12_4_;
  fVar182 = auVar19._0_4_;
  fVar196 = auVar19._4_4_;
  fVar197 = auVar19._8_4_;
  fVar198 = auVar19._12_4_;
  auVar118._0_4_ = fVar182 * auVar96._0_4_ + fVar199 * auVar190._0_4_ + fVar270 * auVar176._0_4_;
  auVar118._4_4_ = fVar196 * auVar96._4_4_ + fVar224 * auVar190._4_4_ + fVar150 * auVar176._4_4_;
  auVar118._8_4_ = fVar197 * auVar96._8_4_ + fVar225 * auVar190._8_4_ + fVar180 * auVar176._8_4_;
  auVar118._12_4_ = fVar198 * auVar96._12_4_ + fVar226 * auVar190._12_4_ + fVar181 * auVar176._12_4_
  ;
  auVar76._0_4_ = fVar182 * auVar141._0_4_ + auVar166._0_4_ * fVar270 + fVar199 * auVar130._0_4_;
  auVar76._4_4_ = fVar196 * auVar141._4_4_ + auVar166._4_4_ * fVar150 + fVar224 * auVar130._4_4_;
  auVar76._8_4_ = fVar197 * auVar141._8_4_ + auVar166._8_4_ * fVar180 + fVar225 * auVar130._8_4_;
  auVar76._12_4_ = fVar198 * auVar141._12_4_ + auVar166._12_4_ * fVar181 + fVar226 * auVar130._12_4_
  ;
  auVar271._8_4_ = 0x7fffffff;
  auVar271._0_8_ = 0x7fffffff7fffffff;
  auVar271._12_4_ = 0x7fffffff;
  auVar96 = vandps_avx(auVar322,auVar271);
  auVar200._8_4_ = 0x219392ef;
  auVar200._0_8_ = 0x219392ef219392ef;
  auVar200._12_4_ = 0x219392ef;
  auVar96 = vcmpps_avx(auVar96,auVar200,1);
  auVar190 = vblendvps_avx(auVar322,auVar200,auVar96);
  auVar96 = vandps_avx(auVar330,auVar271);
  auVar96 = vcmpps_avx(auVar96,auVar200,1);
  auVar176 = vblendvps_avx(auVar330,auVar200,auVar96);
  auVar96 = vandps_avx(auVar271,auVar259);
  auVar96 = vcmpps_avx(auVar96,auVar200,1);
  auVar96 = vblendvps_avx(auVar259,auVar200,auVar96);
  auVar151._0_4_ = fVar182 * auVar131._0_4_ + fVar199 * auVar257._0_4_ + auVar18._0_4_ * fVar270;
  auVar151._4_4_ = fVar196 * auVar131._4_4_ + fVar224 * auVar257._4_4_ + auVar18._4_4_ * fVar150;
  auVar151._8_4_ = fVar197 * auVar131._8_4_ + fVar225 * auVar257._8_4_ + auVar18._8_4_ * fVar180;
  auVar151._12_4_ = fVar198 * auVar131._12_4_ + fVar226 * auVar257._12_4_ + auVar18._12_4_ * fVar181
  ;
  auVar141 = vrcpps_avx(auVar190);
  fVar182 = auVar141._0_4_;
  auVar183._0_4_ = fVar182 * auVar190._0_4_;
  fVar196 = auVar141._4_4_;
  auVar183._4_4_ = fVar196 * auVar190._4_4_;
  fVar197 = auVar141._8_4_;
  auVar183._8_4_ = fVar197 * auVar190._8_4_;
  fVar198 = auVar141._12_4_;
  auVar183._12_4_ = fVar198 * auVar190._12_4_;
  auVar272._8_4_ = 0x3f800000;
  auVar272._0_8_ = 0x3f8000003f800000;
  auVar272._12_4_ = 0x3f800000;
  auVar190 = vsubps_avx(auVar272,auVar183);
  fVar182 = fVar182 + fVar182 * auVar190._0_4_;
  fVar196 = fVar196 + fVar196 * auVar190._4_4_;
  fVar197 = fVar197 + fVar197 * auVar190._8_4_;
  fVar198 = fVar198 + fVar198 * auVar190._12_4_;
  auVar190 = vrcpps_avx(auVar176);
  fVar199 = auVar190._0_4_;
  auVar229._0_4_ = fVar199 * auVar176._0_4_;
  fVar224 = auVar190._4_4_;
  auVar229._4_4_ = fVar224 * auVar176._4_4_;
  fVar225 = auVar190._8_4_;
  auVar229._8_4_ = fVar225 * auVar176._8_4_;
  fVar226 = auVar190._12_4_;
  auVar229._12_4_ = fVar226 * auVar176._12_4_;
  auVar190 = vsubps_avx(auVar272,auVar229);
  fVar199 = fVar199 + fVar199 * auVar190._0_4_;
  fVar224 = fVar224 + fVar224 * auVar190._4_4_;
  fVar225 = fVar225 + fVar225 * auVar190._8_4_;
  fVar226 = fVar226 + fVar226 * auVar190._12_4_;
  auVar190 = vrcpps_avx(auVar96);
  fVar228 = auVar190._0_4_;
  auVar249._0_4_ = fVar228 * auVar96._0_4_;
  fVar246 = auVar190._4_4_;
  auVar249._4_4_ = fVar246 * auVar96._4_4_;
  fVar247 = auVar190._8_4_;
  auVar249._8_4_ = fVar247 * auVar96._8_4_;
  fVar248 = auVar190._12_4_;
  auVar249._12_4_ = fVar248 * auVar96._12_4_;
  auVar96 = vsubps_avx(auVar272,auVar249);
  fVar228 = fVar228 + fVar228 * auVar96._0_4_;
  fVar246 = fVar246 + fVar246 * auVar96._4_4_;
  fVar247 = fVar247 + fVar247 * auVar96._8_4_;
  fVar248 = fVar248 + fVar248 * auVar96._12_4_;
  auVar96 = ZEXT416((uint)(((ray->dir).field_0.m128[3] - *(float *)(prim + lVar67 + 0x16)) *
                          *(float *)(prim + lVar67 + 0x1a)));
  auVar176 = vshufps_avx(auVar96,auVar96,0);
  auVar96._8_8_ = 0;
  auVar96._0_8_ = *(ulong *)(prim + uVar66 * 7 + 6);
  auVar96 = vpmovsxwd_avx(auVar96);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar190._8_8_ = 0;
  auVar190._0_8_ = *(ulong *)(prim + uVar66 * 0xb + 6);
  auVar190 = vpmovsxwd_avx(auVar190);
  auVar190 = vcvtdq2ps_avx(auVar190);
  auVar141 = vsubps_avx(auVar190,auVar96);
  fVar270 = auVar176._0_4_;
  fVar150 = auVar176._4_4_;
  fVar180 = auVar176._8_4_;
  fVar181 = auVar176._12_4_;
  auVar176._8_8_ = 0;
  auVar176._0_8_ = *(ulong *)(prim + uVar66 * 9 + 6);
  auVar190 = vpmovsxwd_avx(auVar176);
  auVar260._0_4_ = auVar141._0_4_ * fVar270 + auVar96._0_4_;
  auVar260._4_4_ = auVar141._4_4_ * fVar150 + auVar96._4_4_;
  auVar260._8_4_ = auVar141._8_4_ * fVar180 + auVar96._8_4_;
  auVar260._12_4_ = auVar141._12_4_ * fVar181 + auVar96._12_4_;
  auVar141._8_8_ = 0;
  auVar141._0_8_ = *(ulong *)(prim + uVar66 * 0xd + 6);
  auVar176 = vpmovsxwd_avx(auVar141);
  auVar96 = vcvtdq2ps_avx(auVar190);
  auVar190 = vcvtdq2ps_avx(auVar176);
  auVar190 = vsubps_avx(auVar190,auVar96);
  auVar273._0_4_ = auVar190._0_4_ * fVar270 + auVar96._0_4_;
  auVar273._4_4_ = auVar190._4_4_ * fVar150 + auVar96._4_4_;
  auVar273._8_4_ = auVar190._8_4_ * fVar180 + auVar96._8_4_;
  auVar273._12_4_ = auVar190._12_4_ * fVar181 + auVar96._12_4_;
  auVar130._8_8_ = 0;
  auVar130._0_8_ = *(ulong *)(prim + uVar66 * 0x12 + 6);
  auVar96 = vpmovsxwd_avx(auVar130);
  uVar74 = (ulong)(uint)((int)(uVar66 * 5) << 2);
  auVar166._8_8_ = 0;
  auVar166._0_8_ = *(ulong *)(prim + uVar66 * 2 + uVar74 + 6);
  auVar190 = vpmovsxwd_avx(auVar166);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar190 = vcvtdq2ps_avx(auVar190);
  auVar190 = vsubps_avx(auVar190,auVar96);
  auVar289._0_4_ = auVar190._0_4_ * fVar270 + auVar96._0_4_;
  auVar289._4_4_ = auVar190._4_4_ * fVar150 + auVar96._4_4_;
  auVar289._8_4_ = auVar190._8_4_ * fVar180 + auVar96._8_4_;
  auVar289._12_4_ = auVar190._12_4_ * fVar181 + auVar96._12_4_;
  auVar131._8_8_ = 0;
  auVar131._0_8_ = *(ulong *)(prim + uVar74 + 6);
  auVar96 = vpmovsxwd_avx(auVar131);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar257._8_8_ = 0;
  auVar257._0_8_ = *(ulong *)(prim + uVar66 * 0x18 + 6);
  auVar190 = vpmovsxwd_avx(auVar257);
  auVar190 = vcvtdq2ps_avx(auVar190);
  auVar176 = vsubps_avx(auVar190,auVar96);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar66 * 0x1d + 6);
  auVar190 = vpmovsxwd_avx(auVar18);
  auVar301._0_4_ = auVar176._0_4_ * fVar270 + auVar96._0_4_;
  auVar301._4_4_ = auVar176._4_4_ * fVar150 + auVar96._4_4_;
  auVar301._8_4_ = auVar176._8_4_ * fVar180 + auVar96._8_4_;
  auVar301._12_4_ = auVar176._12_4_ * fVar181 + auVar96._12_4_;
  auVar96 = vcvtdq2ps_avx(auVar190);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar66 + (ulong)(byte)PVar11 * 0x20 + 6);
  auVar190 = vpmovsxwd_avx(auVar19);
  auVar190 = vcvtdq2ps_avx(auVar190);
  auVar190 = vsubps_avx(auVar190,auVar96);
  auVar309._0_4_ = auVar190._0_4_ * fVar270 + auVar96._0_4_;
  auVar309._4_4_ = auVar190._4_4_ * fVar150 + auVar96._4_4_;
  auVar309._8_4_ = auVar190._8_4_ * fVar180 + auVar96._8_4_;
  auVar309._12_4_ = auVar190._12_4_ * fVar181 + auVar96._12_4_;
  auVar279._8_8_ = 0;
  auVar279._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar11 * 0x20 - uVar66) + 6);
  auVar96 = vpmovsxwd_avx(auVar279);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar66 * 0x23 + 6);
  auVar190 = vpmovsxwd_avx(auVar20);
  auVar190 = vcvtdq2ps_avx(auVar190);
  auVar190 = vsubps_avx(auVar190,auVar96);
  auVar250._0_4_ = auVar96._0_4_ + auVar190._0_4_ * fVar270;
  auVar250._4_4_ = auVar96._4_4_ + auVar190._4_4_ * fVar150;
  auVar250._8_4_ = auVar96._8_4_ + auVar190._8_4_ * fVar180;
  auVar250._12_4_ = auVar96._12_4_ + auVar190._12_4_ * fVar181;
  auVar96 = vsubps_avx(auVar260,auVar118);
  auVar261._0_4_ = fVar182 * auVar96._0_4_;
  auVar261._4_4_ = fVar196 * auVar96._4_4_;
  auVar261._8_4_ = fVar197 * auVar96._8_4_;
  auVar261._12_4_ = fVar198 * auVar96._12_4_;
  auVar96 = vsubps_avx(auVar273,auVar118);
  auVar119._0_4_ = fVar182 * auVar96._0_4_;
  auVar119._4_4_ = fVar196 * auVar96._4_4_;
  auVar119._8_4_ = fVar197 * auVar96._8_4_;
  auVar119._12_4_ = fVar198 * auVar96._12_4_;
  auVar96 = vsubps_avx(auVar289,auVar76);
  auVar184._0_4_ = fVar199 * auVar96._0_4_;
  auVar184._4_4_ = fVar224 * auVar96._4_4_;
  auVar184._8_4_ = fVar225 * auVar96._8_4_;
  auVar184._12_4_ = fVar226 * auVar96._12_4_;
  auVar96 = vsubps_avx(auVar301,auVar76);
  auVar77._0_4_ = fVar199 * auVar96._0_4_;
  auVar77._4_4_ = fVar224 * auVar96._4_4_;
  auVar77._8_4_ = fVar225 * auVar96._8_4_;
  auVar77._12_4_ = fVar226 * auVar96._12_4_;
  auVar96 = vsubps_avx(auVar309,auVar151);
  auVar201._0_4_ = fVar228 * auVar96._0_4_;
  auVar201._4_4_ = fVar246 * auVar96._4_4_;
  auVar201._8_4_ = fVar247 * auVar96._8_4_;
  auVar201._12_4_ = fVar248 * auVar96._12_4_;
  auVar96 = vsubps_avx(auVar250,auVar151);
  auVar152._0_4_ = fVar228 * auVar96._0_4_;
  auVar152._4_4_ = fVar246 * auVar96._4_4_;
  auVar152._8_4_ = fVar247 * auVar96._8_4_;
  auVar152._12_4_ = fVar248 * auVar96._12_4_;
  auVar96 = vpminsd_avx(auVar261,auVar119);
  auVar190 = vpminsd_avx(auVar184,auVar77);
  auVar96 = vmaxps_avx(auVar96,auVar190);
  auVar190 = vpminsd_avx(auVar201,auVar152);
  uVar8 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar274._4_4_ = uVar8;
  auVar274._0_4_ = uVar8;
  auVar274._8_4_ = uVar8;
  auVar274._12_4_ = uVar8;
  auVar190 = vmaxps_avx(auVar190,auVar274);
  auVar96 = vmaxps_avx(auVar96,auVar190);
  local_208._0_4_ = auVar96._0_4_ * 0.99999964;
  local_208._4_4_ = auVar96._4_4_ * 0.99999964;
  local_208._8_4_ = auVar96._8_4_ * 0.99999964;
  local_208._12_4_ = auVar96._12_4_ * 0.99999964;
  auVar96 = vpmaxsd_avx(auVar261,auVar119);
  auVar190 = vpmaxsd_avx(auVar184,auVar77);
  auVar96 = vminps_avx(auVar96,auVar190);
  auVar190 = vpmaxsd_avx(auVar201,auVar152);
  fVar270 = ray->tfar;
  auVar153._4_4_ = fVar270;
  auVar153._0_4_ = fVar270;
  auVar153._8_4_ = fVar270;
  auVar153._12_4_ = fVar270;
  auVar190 = vminps_avx(auVar190,auVar153);
  auVar96 = vminps_avx(auVar96,auVar190);
  auVar78._0_4_ = auVar96._0_4_ * 1.0000004;
  auVar78._4_4_ = auVar96._4_4_ * 1.0000004;
  auVar78._8_4_ = auVar96._8_4_ * 1.0000004;
  auVar78._12_4_ = auVar96._12_4_ * 1.0000004;
  auVar96 = vpshufd_avx(ZEXT116((byte)PVar11),0);
  auVar190 = vpcmpgtd_avx(auVar96,_DAT_01f7fcf0);
  auVar96 = vcmpps_avx(local_208,auVar78,2);
  auVar96 = vandps_avx(auVar96,auVar190);
  uVar65 = vmovmskps_avx(auVar96);
  if (uVar65 == 0) {
    return false;
  }
  auVar108._16_16_ = mm_lookupmask_ps._240_16_;
  auVar108._0_16_ = mm_lookupmask_ps._240_16_;
  uVar65 = uVar65 & 0xff;
  local_158 = vblendps_avx(auVar108,ZEXT832(0) << 0x20,0x80);
  local_2e0 = prim;
LAB_00f22e73:
  lVar67 = 0;
  if ((ulong)uVar65 != 0) {
    for (; (uVar65 >> lVar67 & 1) == 0; lVar67 = lVar67 + 1) {
    }
  }
  local_430 = (ulong)*(uint *)(local_2e0 + 2);
  local_2e8 = (ulong)*(uint *)(local_2e0 + lVar67 * 4 + 6);
  pGVar12 = (context->scene->geometries).items[local_430].ptr;
  fVar270 = (pGVar12->time_range).lower;
  fVar270 = pGVar12->fnumTimeSegments *
            (((ray->dir).field_0.m128[3] - fVar270) / ((pGVar12->time_range).upper - fVar270));
  auVar96 = vroundss_avx(ZEXT416((uint)fVar270),ZEXT416((uint)fVar270),9);
  auVar96 = vminss_avx(auVar96,ZEXT416((uint)(pGVar12->fnumTimeSegments + -1.0)));
  auVar96 = vmaxss_avx(ZEXT816(0) << 0x20,auVar96);
  uVar66 = (ulong)*(uint *)(*(long *)&pGVar12->field_0x58 +
                           local_2e8 *
                           pGVar12[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var13 = pGVar12[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar70 = (long)(int)auVar96._0_4_ * 0x38;
  lVar14 = *(long *)(_Var13 + lVar70);
  lVar15 = *(long *)(_Var13 + 0x10 + lVar70);
  pfVar3 = (float *)(lVar14 + lVar15 * uVar66);
  fVar150 = *pfVar3;
  fVar180 = pfVar3[1];
  fVar181 = pfVar3[2];
  fVar182 = pfVar3[3];
  lVar67 = uVar66 + 1;
  pfVar3 = (float *)(lVar14 + lVar15 * lVar67);
  lVar1 = uVar66 + 2;
  pfVar4 = (float *)(lVar14 + lVar15 * lVar1);
  lVar2 = uVar66 + 3;
  pfVar5 = (float *)(lVar14 + lVar15 * lVar2);
  fVar196 = *pfVar5;
  fVar197 = pfVar5[1];
  fVar198 = pfVar5[2];
  fVar199 = pfVar5[3];
  lVar14 = *(long *)&pGVar12[4].fnumTimeSegments;
  lVar15 = *(long *)(lVar14 + lVar70);
  lVar16 = *(long *)(lVar14 + 0x10 + lVar70);
  pfVar5 = (float *)(lVar15 + lVar16 * uVar66);
  fVar224 = *pfVar5;
  fVar225 = pfVar5[1];
  fVar226 = pfVar5[2];
  fVar228 = pfVar5[3];
  pfVar5 = (float *)(lVar15 + lVar16 * lVar67);
  pfVar6 = (float *)(lVar15 + lVar16 * lVar1);
  fVar270 = fVar270 - auVar96._0_4_;
  pfVar7 = (float *)(lVar15 + lVar16 * lVar2);
  fVar246 = *pfVar7;
  fVar247 = pfVar7[1];
  fVar248 = pfVar7[2];
  fVar227 = pfVar7[3];
  fVar288 = *pfVar4 * 0.0;
  fVar298 = pfVar4[1] * 0.0;
  fVar299 = pfVar4[2] * 0.0;
  fVar300 = pfVar4[3] * 0.0;
  fVar75 = fVar288 + fVar196 * 0.0;
  fVar114 = fVar298 + fVar197 * 0.0;
  fVar115 = fVar299 + fVar198 * 0.0;
  fVar116 = fVar300 + fVar199 * 0.0;
  fVar307 = *pfVar3 * 0.0;
  fVar315 = pfVar3[1] * 0.0;
  fVar317 = pfVar3[2] * 0.0;
  fVar319 = pfVar3[3] * 0.0;
  local_4b8._0_4_ = fVar150 + fVar307 + fVar75;
  local_4b8._4_4_ = fVar180 + fVar315 + fVar114;
  fStack_4b0 = fVar181 + fVar317 + fVar115;
  fStack_4ac = fVar182 + fVar319 + fVar116;
  auVar79._0_4_ = *pfVar3 * 3.0 + fVar75;
  auVar79._4_4_ = pfVar3[1] * 3.0 + fVar114;
  auVar79._8_4_ = pfVar3[2] * 3.0 + fVar115;
  auVar79._12_4_ = pfVar3[3] * 3.0 + fVar116;
  auVar154._0_4_ = fVar150 * 3.0;
  auVar154._4_4_ = fVar180 * 3.0;
  auVar154._8_4_ = fVar181 * 3.0;
  auVar154._12_4_ = fVar182 * 3.0;
  auVar257 = vsubps_avx(auVar79,auVar154);
  fVar321 = *pfVar6 * 0.0;
  fVar326 = pfVar6[1] * 0.0;
  fVar327 = pfVar6[2] * 0.0;
  fVar328 = pfVar6[3] * 0.0;
  fVar75 = fVar321 + fVar246 * 0.0;
  fVar114 = fVar326 + fVar247 * 0.0;
  fVar115 = fVar327 + fVar248 * 0.0;
  fVar116 = fVar328 + fVar227 * 0.0;
  fVar329 = *pfVar5 * 0.0;
  fVar334 = pfVar5[1] * 0.0;
  fVar335 = pfVar5[2] * 0.0;
  fVar336 = pfVar5[3] * 0.0;
  auVar337._0_4_ = fVar329 + fVar75 + fVar224;
  auVar337._4_4_ = fVar334 + fVar114 + fVar225;
  auVar337._8_4_ = fVar335 + fVar115 + fVar226;
  auVar337._12_4_ = fVar336 + fVar116 + fVar228;
  auVar80._0_4_ = *pfVar5 * 3.0 + fVar75;
  auVar80._4_4_ = pfVar5[1] * 3.0 + fVar114;
  auVar80._8_4_ = pfVar5[2] * 3.0 + fVar115;
  auVar80._12_4_ = pfVar5[3] * 3.0 + fVar116;
  auVar251._0_4_ = fVar224 * 3.0;
  auVar251._4_4_ = fVar225 * 3.0;
  auVar251._8_4_ = fVar226 * 3.0;
  auVar251._12_4_ = fVar228 * 3.0;
  auVar141 = vsubps_avx(auVar80,auVar251);
  auVar185._0_4_ = fVar150 * 0.0;
  auVar185._4_4_ = fVar180 * 0.0;
  auVar185._8_4_ = fVar181 * 0.0;
  auVar185._12_4_ = fVar182 * 0.0;
  auVar252._0_4_ = auVar185._0_4_ + fVar307 + fVar288 + fVar196;
  auVar252._4_4_ = auVar185._4_4_ + fVar315 + fVar298 + fVar197;
  auVar252._8_4_ = auVar185._8_4_ + fVar317 + fVar299 + fVar198;
  auVar252._12_4_ = auVar185._12_4_ + fVar319 + fVar300 + fVar199;
  auVar262._0_4_ = fVar196 * 3.0;
  auVar262._4_4_ = fVar197 * 3.0;
  auVar262._8_4_ = fVar198 * 3.0;
  auVar262._12_4_ = fVar199 * 3.0;
  auVar202._0_4_ = *pfVar4 * 3.0;
  auVar202._4_4_ = pfVar4[1] * 3.0;
  auVar202._8_4_ = pfVar4[2] * 3.0;
  auVar202._12_4_ = pfVar4[3] * 3.0;
  auVar96 = vsubps_avx(auVar262,auVar202);
  auVar203._0_4_ = fVar307 + auVar96._0_4_;
  auVar203._4_4_ = fVar315 + auVar96._4_4_;
  auVar203._8_4_ = fVar317 + auVar96._8_4_;
  auVar203._12_4_ = fVar319 + auVar96._12_4_;
  auVar18 = vsubps_avx(auVar203,auVar185);
  auVar204._0_4_ = fVar224 * 0.0;
  auVar204._4_4_ = fVar225 * 0.0;
  auVar204._8_4_ = fVar226 * 0.0;
  auVar204._12_4_ = fVar228 * 0.0;
  auVar186._0_4_ = auVar204._0_4_ + fVar329 + fVar321 + fVar246;
  auVar186._4_4_ = auVar204._4_4_ + fVar334 + fVar326 + fVar247;
  auVar186._8_4_ = auVar204._8_4_ + fVar335 + fVar327 + fVar248;
  auVar186._12_4_ = auVar204._12_4_ + fVar336 + fVar328 + fVar227;
  auVar230._0_4_ = fVar246 * 3.0;
  auVar230._4_4_ = fVar247 * 3.0;
  auVar230._8_4_ = fVar248 * 3.0;
  auVar230._12_4_ = fVar227 * 3.0;
  auVar263._0_4_ = *pfVar6 * 3.0;
  auVar263._4_4_ = pfVar6[1] * 3.0;
  auVar263._8_4_ = pfVar6[2] * 3.0;
  auVar263._12_4_ = pfVar6[3] * 3.0;
  auVar96 = vsubps_avx(auVar230,auVar263);
  auVar231._0_4_ = fVar329 + auVar96._0_4_;
  auVar231._4_4_ = fVar334 + auVar96._4_4_;
  auVar231._8_4_ = fVar335 + auVar96._8_4_;
  auVar231._12_4_ = fVar336 + auVar96._12_4_;
  auVar166 = vsubps_avx(auVar231,auVar204);
  auVar96 = vshufps_avx(auVar257,auVar257,0xc9);
  auVar190 = vshufps_avx(auVar337,auVar337,0xc9);
  fVar75 = auVar257._0_4_;
  auVar232._0_4_ = fVar75 * auVar190._0_4_;
  fVar114 = auVar257._4_4_;
  auVar232._4_4_ = fVar114 * auVar190._4_4_;
  fVar115 = auVar257._8_4_;
  auVar232._8_4_ = fVar115 * auVar190._8_4_;
  fVar116 = auVar257._12_4_;
  auVar232._12_4_ = fVar116 * auVar190._12_4_;
  auVar275._0_4_ = auVar337._0_4_ * auVar96._0_4_;
  auVar275._4_4_ = auVar337._4_4_ * auVar96._4_4_;
  auVar275._8_4_ = auVar337._8_4_ * auVar96._8_4_;
  auVar275._12_4_ = auVar337._12_4_ * auVar96._12_4_;
  auVar190 = vsubps_avx(auVar275,auVar232);
  auVar176 = vshufps_avx(auVar190,auVar190,0xc9);
  auVar190 = vshufps_avx(auVar141,auVar141,0xc9);
  auVar276._0_4_ = auVar190._0_4_ * fVar75;
  auVar276._4_4_ = auVar190._4_4_ * fVar114;
  auVar276._8_4_ = auVar190._8_4_ * fVar115;
  auVar276._12_4_ = auVar190._12_4_ * fVar116;
  auVar81._0_4_ = auVar96._0_4_ * auVar141._0_4_;
  auVar81._4_4_ = auVar96._4_4_ * auVar141._4_4_;
  auVar81._8_4_ = auVar96._8_4_ * auVar141._8_4_;
  auVar81._12_4_ = auVar96._12_4_ * auVar141._12_4_;
  auVar96 = vsubps_avx(auVar81,auVar276);
  auVar141 = vshufps_avx(auVar96,auVar96,0xc9);
  auVar96 = vshufps_avx(auVar18,auVar18,0xc9);
  auVar190 = vshufps_avx(auVar186,auVar186,0xc9);
  fVar329 = auVar18._0_4_;
  auVar277._0_4_ = fVar329 * auVar190._0_4_;
  fVar334 = auVar18._4_4_;
  auVar277._4_4_ = fVar334 * auVar190._4_4_;
  fVar335 = auVar18._8_4_;
  auVar277._8_4_ = fVar335 * auVar190._8_4_;
  fVar336 = auVar18._12_4_;
  auVar277._12_4_ = fVar336 * auVar190._12_4_;
  auVar187._0_4_ = auVar96._0_4_ * auVar186._0_4_;
  auVar187._4_4_ = auVar96._4_4_ * auVar186._4_4_;
  auVar187._8_4_ = auVar96._8_4_ * auVar186._8_4_;
  auVar187._12_4_ = auVar96._12_4_ * auVar186._12_4_;
  auVar190 = vsubps_avx(auVar187,auVar277);
  auVar130 = vshufps_avx(auVar190,auVar190,0xc9);
  auVar190 = vshufps_avx(auVar166,auVar166,0xc9);
  auVar278._0_4_ = fVar329 * auVar190._0_4_;
  auVar278._4_4_ = fVar334 * auVar190._4_4_;
  auVar278._8_4_ = fVar335 * auVar190._8_4_;
  auVar278._12_4_ = fVar336 * auVar190._12_4_;
  auVar205._0_4_ = auVar96._0_4_ * auVar166._0_4_;
  auVar205._4_4_ = auVar96._4_4_ * auVar166._4_4_;
  auVar205._8_4_ = auVar96._8_4_ * auVar166._8_4_;
  auVar205._12_4_ = auVar96._12_4_ * auVar166._12_4_;
  auVar96 = vdpps_avx(auVar176,auVar176,0x7f);
  auVar190 = vsubps_avx(auVar205,auVar278);
  auVar166 = vshufps_avx(auVar190,auVar190,0xc9);
  fVar180 = auVar96._0_4_;
  auVar279 = ZEXT416((uint)fVar180);
  auVar190 = vrsqrtss_avx(auVar279,auVar279);
  fVar150 = auVar190._0_4_;
  auVar190 = ZEXT416((uint)(fVar150 * 1.5 - fVar180 * 0.5 * fVar150 * fVar150 * fVar150));
  auVar131 = vshufps_avx(auVar190,auVar190,0);
  fVar246 = auVar131._0_4_ * auVar176._0_4_;
  fVar247 = auVar131._4_4_ * auVar176._4_4_;
  fVar248 = auVar131._8_4_ * auVar176._8_4_;
  fVar227 = auVar131._12_4_ * auVar176._12_4_;
  auVar190 = vdpps_avx(auVar176,auVar141,0x7f);
  auVar96 = vshufps_avx(auVar96,auVar96,0);
  auVar82._0_4_ = auVar96._0_4_ * auVar141._0_4_;
  auVar82._4_4_ = auVar96._4_4_ * auVar141._4_4_;
  auVar82._8_4_ = auVar96._8_4_ * auVar141._8_4_;
  auVar82._12_4_ = auVar96._12_4_ * auVar141._12_4_;
  auVar96 = vshufps_avx(auVar190,auVar190,0);
  auVar233._0_4_ = auVar96._0_4_ * auVar176._0_4_;
  auVar233._4_4_ = auVar96._4_4_ * auVar176._4_4_;
  auVar233._8_4_ = auVar96._8_4_ * auVar176._8_4_;
  auVar233._12_4_ = auVar96._12_4_ * auVar176._12_4_;
  auVar19 = vsubps_avx(auVar82,auVar233);
  auVar96 = vrcpss_avx(auVar279,auVar279);
  auVar96 = ZEXT416((uint)(auVar96._0_4_ * (2.0 - fVar180 * auVar96._0_4_)));
  auVar176 = vshufps_avx(auVar96,auVar96,0);
  auVar96 = vdpps_avx(auVar130,auVar130,0x7f);
  fVar288 = auVar96._0_4_;
  auVar141 = ZEXT416((uint)fVar288);
  auVar190 = vrsqrtss_avx(auVar141,auVar141);
  fVar224 = auVar190._0_4_;
  auVar190 = vdpps_avx(auVar130,auVar166,0x7f);
  auVar96 = vshufps_avx(auVar96,auVar96,0);
  auVar346._0_4_ = auVar166._0_4_ * auVar96._0_4_;
  auVar346._4_4_ = auVar166._4_4_ * auVar96._4_4_;
  auVar346._8_4_ = auVar166._8_4_ * auVar96._8_4_;
  auVar346._12_4_ = auVar166._12_4_ * auVar96._12_4_;
  lVar15 = *(long *)(_Var13 + 0x38 + lVar70);
  lVar16 = *(long *)(_Var13 + 0x48 + lVar70);
  pfVar3 = (float *)(lVar15 + lVar16 * uVar66);
  fVar150 = *pfVar3;
  fVar180 = pfVar3[1];
  fVar181 = pfVar3[2];
  fVar182 = pfVar3[3];
  pfVar3 = (float *)(lVar15 + lVar16 * lVar67);
  pfVar4 = (float *)(lVar15 + lVar16 * lVar1);
  auVar96 = vshufps_avx(auVar190,auVar190,0);
  auVar83._0_4_ = auVar130._0_4_ * auVar96._0_4_;
  auVar83._4_4_ = auVar130._4_4_ * auVar96._4_4_;
  auVar83._8_4_ = auVar130._8_4_ * auVar96._8_4_;
  auVar83._12_4_ = auVar130._12_4_ * auVar96._12_4_;
  auVar166 = vsubps_avx(auVar346,auVar83);
  pfVar5 = (float *)(lVar15 + lVar16 * lVar2);
  fVar196 = *pfVar5;
  fVar197 = pfVar5[1];
  fVar198 = pfVar5[2];
  fVar199 = pfVar5[3];
  auVar96 = ZEXT416((uint)(fVar224 * 1.5 - fVar288 * 0.5 * fVar224 * fVar224 * fVar224));
  auVar190 = vshufps_avx(auVar96,auVar96,0);
  fVar224 = auVar190._0_4_ * auVar130._0_4_;
  fVar225 = auVar190._4_4_ * auVar130._4_4_;
  fVar226 = auVar190._8_4_ * auVar130._8_4_;
  fVar228 = auVar190._12_4_ * auVar130._12_4_;
  auVar96 = vrcpss_avx(auVar141,auVar141);
  auVar96 = ZEXT416((uint)(auVar96._0_4_ * (2.0 - auVar96._0_4_ * fVar288)));
  auVar96 = vshufps_avx(auVar96,auVar96,0);
  auVar141 = vshufps_avx(_local_4b8,_local_4b8,0xff);
  auVar338._0_4_ = auVar141._0_4_ * fVar246;
  auVar338._4_4_ = auVar141._4_4_ * fVar247;
  auVar338._8_4_ = auVar141._8_4_ * fVar248;
  auVar338._12_4_ = auVar141._12_4_ * fVar227;
  auVar130 = vshufps_avx(auVar257,auVar257,0xff);
  auVar279 = vsubps_avx(_local_4b8,auVar338);
  auVar264._0_4_ =
       auVar130._0_4_ * fVar246 + auVar141._0_4_ * auVar131._0_4_ * auVar19._0_4_ * auVar176._0_4_;
  auVar264._4_4_ =
       auVar130._4_4_ * fVar247 + auVar141._4_4_ * auVar131._4_4_ * auVar19._4_4_ * auVar176._4_4_;
  auVar264._8_4_ =
       auVar130._8_4_ * fVar248 + auVar141._8_4_ * auVar131._8_4_ * auVar19._8_4_ * auVar176._8_4_;
  auVar264._12_4_ =
       auVar130._12_4_ * fVar227 +
       auVar141._12_4_ * auVar131._12_4_ * auVar19._12_4_ * auVar176._12_4_;
  auVar131 = vsubps_avx(auVar257,auVar264);
  local_4b8._0_4_ = (float)local_4b8._0_4_ + auVar338._0_4_;
  local_4b8._4_4_ = (float)local_4b8._4_4_ + auVar338._4_4_;
  fStack_4b0 = fStack_4b0 + auVar338._8_4_;
  fStack_4ac = fStack_4ac + auVar338._12_4_;
  auVar176 = vshufps_avx(auVar252,auVar252,0xff);
  auVar155._0_4_ = auVar176._0_4_ * fVar224;
  auVar155._4_4_ = auVar176._4_4_ * fVar225;
  auVar155._8_4_ = auVar176._8_4_ * fVar226;
  auVar155._12_4_ = auVar176._12_4_ * fVar228;
  auVar141 = vshufps_avx(auVar18,auVar18,0xff);
  auVar257 = vsubps_avx(auVar252,auVar155);
  auVar84._0_4_ =
       auVar141._0_4_ * fVar224 + auVar176._0_4_ * auVar190._0_4_ * auVar166._0_4_ * auVar96._0_4_;
  auVar84._4_4_ =
       auVar141._4_4_ * fVar225 + auVar176._4_4_ * auVar190._4_4_ * auVar166._4_4_ * auVar96._4_4_;
  auVar84._8_4_ =
       auVar141._8_4_ * fVar226 + auVar176._8_4_ * auVar190._8_4_ * auVar166._8_4_ * auVar96._8_4_;
  auVar84._12_4_ =
       auVar141._12_4_ * fVar228 +
       auVar176._12_4_ * auVar190._12_4_ * auVar166._12_4_ * auVar96._12_4_;
  auVar18 = vsubps_avx(auVar18,auVar84);
  local_448._4_4_ = auVar252._4_4_ + auVar155._4_4_;
  local_448._0_4_ = auVar252._0_4_ + auVar155._0_4_;
  fStack_440 = auVar252._8_4_ + auVar155._8_4_;
  fStack_43c = auVar252._12_4_ + auVar155._12_4_;
  fVar307 = *pfVar4 * 0.0;
  fVar315 = pfVar4[1] * 0.0;
  fVar317 = pfVar4[2] * 0.0;
  fVar319 = pfVar4[3] * 0.0;
  fVar345 = fVar307 + fVar196 * 0.0;
  fVar347 = fVar315 + fVar197 * 0.0;
  fVar348 = fVar317 + fVar198 * 0.0;
  fVar349 = fVar319 + fVar199 * 0.0;
  auVar85._0_4_ = fVar345 + *pfVar3 * 3.0;
  auVar85._4_4_ = fVar347 + pfVar3[1] * 3.0;
  auVar85._8_4_ = fVar348 + pfVar3[2] * 3.0;
  auVar85._12_4_ = fVar349 + pfVar3[3] * 3.0;
  auVar156._0_4_ = fVar150 * 3.0;
  auVar156._4_4_ = fVar180 * 3.0;
  auVar156._8_4_ = fVar181 * 3.0;
  auVar156._12_4_ = fVar182 * 3.0;
  auVar19 = vsubps_avx(auVar85,auVar156);
  lVar15 = *(long *)(lVar14 + 0x38 + lVar70);
  lVar14 = *(long *)(lVar14 + 0x48 + lVar70);
  auVar96 = *(undefined1 (*) [16])(lVar15 + lVar1 * lVar14);
  pfVar5 = (float *)(lVar15 + lVar14 * lVar2);
  fVar224 = *pfVar5;
  fVar225 = pfVar5[1];
  fVar226 = pfVar5[2];
  fVar228 = pfVar5[3];
  fVar288 = auVar96._0_4_ * 0.0;
  fVar298 = auVar96._4_4_ * 0.0;
  fVar299 = auVar96._8_4_ * 0.0;
  fVar300 = auVar96._12_4_ * 0.0;
  fVar321 = fVar288 + fVar224 * 0.0;
  fVar326 = fVar298 + fVar225 * 0.0;
  fVar327 = fVar299 + fVar226 * 0.0;
  fVar328 = fVar300 + fVar228 * 0.0;
  pfVar5 = (float *)(lVar15 + lVar67 * lVar14);
  auVar339._0_4_ = *pfVar5 * 3.0 + fVar321;
  auVar339._4_4_ = pfVar5[1] * 3.0 + fVar326;
  auVar339._8_4_ = pfVar5[2] * 3.0 + fVar327;
  auVar339._12_4_ = pfVar5[3] * 3.0 + fVar328;
  pfVar6 = (float *)(lVar15 + uVar66 * lVar14);
  fVar246 = *pfVar6;
  fVar247 = pfVar6[1];
  fVar248 = pfVar6[2];
  fVar227 = pfVar6[3];
  auVar280._0_4_ = fVar246 * 3.0;
  auVar280._4_4_ = fVar247 * 3.0;
  auVar280._8_4_ = fVar248 * 3.0;
  auVar280._12_4_ = fVar227 * 3.0;
  auVar190 = vsubps_avx(auVar339,auVar280);
  auVar281._0_4_ = fVar196 * 3.0;
  auVar281._4_4_ = fVar197 * 3.0;
  auVar281._8_4_ = fVar198 * 3.0;
  auVar281._12_4_ = fVar199 * 3.0;
  auVar323._0_4_ = *pfVar4 * 3.0;
  auVar323._4_4_ = pfVar4[1] * 3.0;
  auVar323._8_4_ = pfVar4[2] * 3.0;
  auVar323._12_4_ = pfVar4[3] * 3.0;
  auVar176 = vsubps_avx(auVar281,auVar323);
  fVar308 = *pfVar3 * 0.0;
  fVar316 = pfVar3[1] * 0.0;
  fVar318 = pfVar3[2] * 0.0;
  fVar320 = pfVar3[3] * 0.0;
  auVar282._0_4_ = fVar308 + auVar176._0_4_;
  auVar282._4_4_ = fVar316 + auVar176._4_4_;
  auVar282._8_4_ = fVar318 + auVar176._8_4_;
  auVar282._12_4_ = fVar320 + auVar176._12_4_;
  auVar324._0_4_ = fVar150 + fVar308 + fVar345;
  auVar324._4_4_ = fVar180 + fVar316 + fVar347;
  auVar324._8_4_ = fVar181 + fVar318 + fVar348;
  auVar324._12_4_ = fVar182 + fVar320 + fVar349;
  auVar302._0_4_ = fVar150 * 0.0;
  auVar302._4_4_ = fVar180 * 0.0;
  auVar302._8_4_ = fVar181 * 0.0;
  auVar302._12_4_ = fVar182 * 0.0;
  local_4d8._0_4_ = auVar302._0_4_ + fVar308 + fVar196 + fVar307;
  local_4d8._4_4_ = auVar302._4_4_ + fVar316 + fVar197 + fVar315;
  fStack_4d0 = auVar302._8_4_ + fVar318 + fVar198 + fVar317;
  fStack_4cc = auVar302._12_4_ + fVar320 + fVar199 + fVar319;
  auVar20 = vsubps_avx(auVar282,auVar302);
  auVar120._0_4_ = fVar224 * 3.0;
  auVar120._4_4_ = fVar225 * 3.0;
  auVar120._8_4_ = fVar226 * 3.0;
  auVar120._12_4_ = fVar228 * 3.0;
  auVar206._0_4_ = auVar96._0_4_ * 3.0;
  auVar206._4_4_ = auVar96._4_4_ * 3.0;
  auVar206._8_4_ = auVar96._8_4_ * 3.0;
  auVar206._12_4_ = auVar96._12_4_ * 3.0;
  auVar96 = vsubps_avx(auVar120,auVar206);
  fVar150 = *pfVar5 * 0.0;
  fVar180 = pfVar5[1] * 0.0;
  fVar181 = pfVar5[2] * 0.0;
  fVar182 = pfVar5[3] * 0.0;
  auVar121._0_4_ = fVar150 + auVar96._0_4_;
  auVar121._4_4_ = fVar180 + auVar96._4_4_;
  auVar121._8_4_ = fVar181 + auVar96._8_4_;
  auVar121._12_4_ = fVar182 + auVar96._12_4_;
  auVar157._0_4_ = fVar246 + fVar150 + fVar321;
  auVar157._4_4_ = fVar247 + fVar180 + fVar326;
  auVar157._8_4_ = fVar248 + fVar181 + fVar327;
  auVar157._12_4_ = fVar227 + fVar182 + fVar328;
  auVar86._0_4_ = fVar246 * 0.0;
  auVar86._4_4_ = fVar247 * 0.0;
  auVar86._8_4_ = fVar248 * 0.0;
  auVar86._12_4_ = fVar227 * 0.0;
  auVar188._0_4_ = auVar86._0_4_ + fVar150 + fVar288 + fVar224;
  auVar188._4_4_ = auVar86._4_4_ + fVar180 + fVar298 + fVar225;
  auVar188._8_4_ = auVar86._8_4_ + fVar181 + fVar299 + fVar226;
  auVar188._12_4_ = auVar86._12_4_ + fVar182 + fVar300 + fVar228;
  auVar141 = vsubps_avx(auVar121,auVar86);
  auVar96 = vshufps_avx(auVar157,auVar157,0xc9);
  fVar199 = auVar19._0_4_;
  auVar122._0_4_ = fVar199 * auVar96._0_4_;
  fVar224 = auVar19._4_4_;
  auVar122._4_4_ = fVar224 * auVar96._4_4_;
  fVar225 = auVar19._8_4_;
  auVar122._8_4_ = fVar225 * auVar96._8_4_;
  fVar226 = auVar19._12_4_;
  auVar122._12_4_ = fVar226 * auVar96._12_4_;
  auVar96 = vshufps_avx(auVar19,auVar19,0xc9);
  auVar158._0_4_ = auVar96._0_4_ * auVar157._0_4_;
  auVar158._4_4_ = auVar96._4_4_ * auVar157._4_4_;
  auVar158._8_4_ = auVar96._8_4_ * auVar157._8_4_;
  auVar158._12_4_ = auVar96._12_4_ * auVar157._12_4_;
  auVar176 = vsubps_avx(auVar158,auVar122);
  auVar159._0_4_ = auVar190._0_4_ * auVar96._0_4_;
  auVar159._4_4_ = auVar190._4_4_ * auVar96._4_4_;
  auVar159._8_4_ = auVar190._8_4_ * auVar96._8_4_;
  auVar159._12_4_ = auVar190._12_4_ * auVar96._12_4_;
  auVar96 = vshufps_avx(auVar190,auVar190,0xc9);
  auVar207._0_4_ = fVar199 * auVar96._0_4_;
  auVar207._4_4_ = fVar224 * auVar96._4_4_;
  auVar207._8_4_ = fVar225 * auVar96._8_4_;
  auVar207._12_4_ = fVar226 * auVar96._12_4_;
  auVar130 = vsubps_avx(auVar159,auVar207);
  auVar96 = vshufps_avx(auVar188,auVar188,0xc9);
  fVar228 = auVar20._0_4_;
  auVar208._0_4_ = fVar228 * auVar96._0_4_;
  fVar246 = auVar20._4_4_;
  auVar208._4_4_ = fVar246 * auVar96._4_4_;
  fVar247 = auVar20._8_4_;
  auVar208._8_4_ = fVar247 * auVar96._8_4_;
  fVar248 = auVar20._12_4_;
  auVar208._12_4_ = fVar248 * auVar96._12_4_;
  auVar96 = vshufps_avx(auVar20,auVar20,0xc9);
  auVar189._0_4_ = auVar96._0_4_ * auVar188._0_4_;
  auVar189._4_4_ = auVar96._4_4_ * auVar188._4_4_;
  auVar189._8_4_ = auVar96._8_4_ * auVar188._8_4_;
  auVar189._12_4_ = auVar96._12_4_ * auVar188._12_4_;
  auVar166 = vsubps_avx(auVar189,auVar208);
  auVar176 = vshufps_avx(auVar176,auVar176,0xc9);
  auVar123._0_4_ = auVar96._0_4_ * auVar141._0_4_;
  auVar123._4_4_ = auVar96._4_4_ * auVar141._4_4_;
  auVar123._8_4_ = auVar96._8_4_ * auVar141._8_4_;
  auVar123._12_4_ = auVar96._12_4_ * auVar141._12_4_;
  auVar190 = vshufps_avx(auVar141,auVar141,0xc9);
  auVar96 = vdpps_avx(auVar176,auVar176,0x7f);
  auVar87._0_4_ = fVar228 * auVar190._0_4_;
  auVar87._4_4_ = fVar246 * auVar190._4_4_;
  auVar87._8_4_ = fVar247 * auVar190._8_4_;
  auVar87._12_4_ = fVar248 * auVar190._12_4_;
  auVar76 = vsubps_avx(auVar123,auVar87);
  auVar141 = vshufps_avx(auVar130,auVar130,0xc9);
  fVar150 = auVar96._0_4_;
  auVar130 = ZEXT416((uint)fVar150);
  auVar190 = vrsqrtss_avx(auVar130,auVar130);
  fVar180 = auVar190._0_4_;
  auVar190 = vdpps_avx(auVar176,auVar141,0x7f);
  auVar96 = vshufps_avx(auVar96,auVar96,0);
  auVar88._0_4_ = auVar96._0_4_ * auVar141._0_4_;
  auVar88._4_4_ = auVar96._4_4_ * auVar141._4_4_;
  auVar88._8_4_ = auVar96._8_4_ * auVar141._8_4_;
  auVar88._12_4_ = auVar96._12_4_ * auVar141._12_4_;
  auVar96 = vshufps_avx(auVar190,auVar190,0);
  auVar234._0_4_ = auVar176._0_4_ * auVar96._0_4_;
  auVar234._4_4_ = auVar176._4_4_ * auVar96._4_4_;
  auVar234._8_4_ = auVar176._8_4_ * auVar96._8_4_;
  auVar234._12_4_ = auVar176._12_4_ * auVar96._12_4_;
  auVar77 = vsubps_avx(auVar88,auVar234);
  auVar96 = vrcpss_avx(auVar130,auVar130);
  auVar96 = ZEXT416((uint)(auVar96._0_4_ * (2.0 - fVar150 * auVar96._0_4_)));
  auVar141 = vshufps_avx(auVar96,auVar96,0);
  auVar130 = vshufps_avx(auVar166,auVar166,0xc9);
  auVar96 = ZEXT416((uint)(fVar180 * 1.5 - fVar150 * 0.5 * fVar180 * fVar180 * fVar180));
  auVar166 = vshufps_avx(auVar96,auVar96,0);
  auVar96 = vdpps_avx(auVar130,auVar130,0x7f);
  fVar196 = auVar176._0_4_ * auVar166._0_4_;
  fVar197 = auVar176._4_4_ * auVar166._4_4_;
  fVar198 = auVar176._8_4_ * auVar166._8_4_;
  fVar227 = auVar176._12_4_ * auVar166._12_4_;
  auVar176 = vshufps_avx(auVar76,auVar76,0xc9);
  fVar180 = auVar96._0_4_;
  auVar78 = ZEXT416((uint)fVar180);
  auVar190 = vrsqrtss_avx(auVar78,auVar78);
  fVar150 = auVar190._0_4_;
  auVar190 = vdpps_avx(auVar130,auVar176,0x7f);
  auVar96 = vshufps_avx(auVar96,auVar96,0);
  auVar124._0_4_ = auVar96._0_4_ * auVar176._0_4_;
  auVar124._4_4_ = auVar96._4_4_ * auVar176._4_4_;
  auVar124._8_4_ = auVar96._8_4_ * auVar176._8_4_;
  auVar124._12_4_ = auVar96._12_4_ * auVar176._12_4_;
  auVar96 = vshufps_avx(auVar190,auVar190,0);
  auVar235._0_4_ = auVar130._0_4_ * auVar96._0_4_;
  auVar235._4_4_ = auVar130._4_4_ * auVar96._4_4_;
  auVar235._8_4_ = auVar130._8_4_ * auVar96._8_4_;
  auVar235._12_4_ = auVar130._12_4_ * auVar96._12_4_;
  auVar76 = vsubps_avx(auVar124,auVar235);
  auVar96 = vrcpss_avx(auVar78,auVar78);
  auVar96 = ZEXT416((uint)(auVar96._0_4_ * (2.0 - fVar180 * auVar96._0_4_)));
  auVar96 = vshufps_avx(auVar96,auVar96,0);
  auVar190 = ZEXT416((uint)(fVar150 * 1.5 - fVar180 * 0.5 * fVar150 * fVar150 * fVar150));
  auVar190 = vshufps_avx(auVar190,auVar190,0);
  fVar150 = auVar130._0_4_ * auVar190._0_4_;
  fVar180 = auVar130._4_4_ * auVar190._4_4_;
  fVar181 = auVar130._8_4_ * auVar190._8_4_;
  fVar182 = auVar130._12_4_ * auVar190._12_4_;
  auVar176 = vshufps_avx(auVar19,auVar19,0xff);
  auVar130 = vshufps_avx(auVar324,auVar324,0xff);
  auVar209._0_4_ = fVar196 * auVar130._0_4_;
  auVar209._4_4_ = fVar197 * auVar130._4_4_;
  auVar209._8_4_ = fVar198 * auVar130._8_4_;
  auVar209._12_4_ = fVar227 * auVar130._12_4_;
  auVar160._0_4_ =
       fVar196 * auVar176._0_4_ + auVar166._0_4_ * auVar77._0_4_ * auVar141._0_4_ * auVar130._0_4_;
  auVar160._4_4_ =
       fVar197 * auVar176._4_4_ + auVar166._4_4_ * auVar77._4_4_ * auVar141._4_4_ * auVar130._4_4_;
  auVar160._8_4_ =
       fVar198 * auVar176._8_4_ + auVar166._8_4_ * auVar77._8_4_ * auVar141._8_4_ * auVar130._8_4_;
  auVar160._12_4_ =
       fVar227 * auVar176._12_4_ +
       auVar166._12_4_ * auVar77._12_4_ * auVar141._12_4_ * auVar130._12_4_;
  auVar130 = vsubps_avx(auVar324,auVar209);
  auVar166 = vsubps_avx(auVar19,auVar160);
  auVar176 = vshufps_avx(auVar20,auVar20,0xff);
  auVar141 = vshufps_avx(_local_4d8,_local_4d8,0xff);
  auVar89._0_4_ = auVar141._0_4_ * fVar150;
  auVar89._4_4_ = auVar141._4_4_ * fVar180;
  auVar89._8_4_ = auVar141._8_4_ * fVar181;
  auVar89._12_4_ = auVar141._12_4_ * fVar182;
  auVar125._0_4_ =
       auVar176._0_4_ * fVar150 + auVar141._0_4_ * auVar190._0_4_ * auVar76._0_4_ * auVar96._0_4_;
  auVar125._4_4_ =
       auVar176._4_4_ * fVar180 + auVar141._4_4_ * auVar190._4_4_ * auVar76._4_4_ * auVar96._4_4_;
  auVar125._8_4_ =
       auVar176._8_4_ * fVar181 + auVar141._8_4_ * auVar190._8_4_ * auVar76._8_4_ * auVar96._8_4_;
  auVar125._12_4_ =
       auVar176._12_4_ * fVar182 +
       auVar141._12_4_ * auVar190._12_4_ * auVar76._12_4_ * auVar96._12_4_;
  auVar176 = vsubps_avx(_local_4d8,auVar89);
  local_4d8._0_4_ = (float)local_4d8._0_4_ + auVar89._0_4_;
  local_4d8._4_4_ = (float)local_4d8._4_4_ + auVar89._4_4_;
  fStack_4d0 = fStack_4d0 + auVar89._8_4_;
  fStack_4cc = fStack_4cc + auVar89._12_4_;
  auVar141 = vsubps_avx(auVar20,auVar125);
  local_418._0_4_ = auVar131._0_4_;
  local_418._4_4_ = auVar131._4_4_;
  fStack_410 = auVar131._8_4_;
  fStack_40c = auVar131._12_4_;
  local_308._0_4_ = auVar279._0_4_;
  local_308._4_4_ = auVar279._4_4_;
  fStack_300 = auVar279._8_4_;
  fStack_2fc = auVar279._12_4_;
  auVar96 = vshufps_avx(ZEXT416((uint)fVar270),ZEXT416((uint)fVar270),0);
  auVar190 = vshufps_avx(ZEXT416((uint)(1.0 - fVar270)),ZEXT416((uint)(1.0 - fVar270)),0);
  fVar182 = auVar96._0_4_;
  fVar196 = auVar96._4_4_;
  fVar197 = auVar96._8_4_;
  fVar198 = auVar96._12_4_;
  fVar270 = auVar190._0_4_;
  fVar150 = auVar190._4_4_;
  fVar180 = auVar190._8_4_;
  fVar181 = auVar190._12_4_;
  local_378._0_4_ = fVar270 * (float)local_308._0_4_ + fVar182 * auVar130._0_4_;
  local_378._4_4_ = fVar150 * (float)local_308._4_4_ + fVar196 * auVar130._4_4_;
  fStack_370 = fVar180 * fStack_300 + fVar197 * auVar130._8_4_;
  fStack_36c = fVar181 * fStack_2fc + fVar198 * auVar130._12_4_;
  local_388._0_4_ =
       fVar270 * ((float)local_308._0_4_ + (float)local_418._0_4_ * 0.33333334) +
       fVar182 * (auVar130._0_4_ + auVar166._0_4_ * 0.33333334);
  local_388._4_4_ =
       fVar150 * ((float)local_308._4_4_ + (float)local_418._4_4_ * 0.33333334) +
       fVar196 * (auVar130._4_4_ + auVar166._4_4_ * 0.33333334);
  fStack_380 = fVar180 * (fStack_300 + fStack_410 * 0.33333334) +
               fVar197 * (auVar130._8_4_ + auVar166._8_4_ * 0.33333334);
  fStack_37c = fVar181 * (fStack_2fc + fStack_40c * 0.33333334) +
               fVar198 * (auVar130._12_4_ + auVar166._12_4_ * 0.33333334);
  local_488._0_4_ = auVar18._0_4_;
  local_488._4_4_ = auVar18._4_4_;
  fStack_480 = auVar18._8_4_;
  fStack_47c = auVar18._12_4_;
  auVar191._0_4_ = (float)local_488._0_4_ * 0.33333334;
  auVar191._4_4_ = (float)local_488._4_4_ * 0.33333334;
  auVar191._8_4_ = fStack_480 * 0.33333334;
  auVar191._12_4_ = fStack_47c * 0.33333334;
  auVar96 = vsubps_avx(auVar257,auVar191);
  auVar236._0_4_ = (fVar329 + auVar84._0_4_) * 0.33333334;
  auVar236._4_4_ = (fVar334 + auVar84._4_4_) * 0.33333334;
  auVar236._8_4_ = (fVar335 + auVar84._8_4_) * 0.33333334;
  auVar236._12_4_ = (fVar336 + auVar84._12_4_) * 0.33333334;
  auVar190 = vsubps_avx(_local_448,auVar236);
  auVar161._0_4_ = auVar141._0_4_ * 0.33333334;
  auVar161._4_4_ = auVar141._4_4_ * 0.33333334;
  auVar161._8_4_ = auVar141._8_4_ * 0.33333334;
  auVar161._12_4_ = auVar141._12_4_ * 0.33333334;
  auVar141 = vsubps_avx(auVar176,auVar161);
  auVar126._0_4_ = (fVar228 + auVar125._0_4_) * 0.33333334;
  auVar126._4_4_ = (fVar246 + auVar125._4_4_) * 0.33333334;
  auVar126._8_4_ = (fVar247 + auVar125._8_4_) * 0.33333334;
  auVar126._12_4_ = (fVar248 + auVar125._12_4_) * 0.33333334;
  auVar130 = vsubps_avx(_local_4d8,auVar126);
  local_398._0_4_ = fVar270 * auVar96._0_4_ + fVar182 * auVar141._0_4_;
  local_398._4_4_ = fVar150 * auVar96._4_4_ + fVar196 * auVar141._4_4_;
  fStack_390 = fVar180 * auVar96._8_4_ + fVar197 * auVar141._8_4_;
  fStack_38c = fVar181 * auVar96._12_4_ + fVar198 * auVar141._12_4_;
  local_3a8._0_4_ = fVar182 * auVar176._0_4_ + auVar257._0_4_ * fVar270;
  local_3a8._4_4_ = fVar196 * auVar176._4_4_ + auVar257._4_4_ * fVar150;
  fStack_3a0 = fVar197 * auVar176._8_4_ + auVar257._8_4_ * fVar180;
  fStack_39c = fVar198 * auVar176._12_4_ + auVar257._12_4_ * fVar181;
  local_3b8._0_4_ = fVar270 * (float)local_4b8._0_4_ + fVar182 * (auVar324._0_4_ + auVar209._0_4_);
  local_3b8._4_4_ = fVar150 * (float)local_4b8._4_4_ + fVar196 * (auVar324._4_4_ + auVar209._4_4_);
  fStack_3b0 = fVar180 * fStack_4b0 + fVar197 * (auVar324._8_4_ + auVar209._8_4_);
  fStack_3ac = fVar181 * fStack_4ac + fVar198 * (auVar324._12_4_ + auVar209._12_4_);
  local_3c8._0_4_ =
       fVar270 * ((float)local_4b8._0_4_ + (fVar75 + auVar264._0_4_) * 0.33333334) +
       fVar182 * (auVar324._0_4_ + auVar209._0_4_ + (fVar199 + auVar160._0_4_) * 0.33333334);
  local_3c8._4_4_ =
       fVar150 * ((float)local_4b8._4_4_ + (fVar114 + auVar264._4_4_) * 0.33333334) +
       fVar196 * (auVar324._4_4_ + auVar209._4_4_ + (fVar224 + auVar160._4_4_) * 0.33333334);
  fStack_3c0 = fVar180 * (fStack_4b0 + (fVar115 + auVar264._8_4_) * 0.33333334) +
               fVar197 * (auVar324._8_4_ + auVar209._8_4_ + (fVar225 + auVar160._8_4_) * 0.33333334)
  ;
  fStack_3bc = fVar181 * (fStack_4ac + (fVar116 + auVar264._12_4_) * 0.33333334) +
               fVar198 * (auVar324._12_4_ + auVar209._12_4_ +
                         (fVar226 + auVar160._12_4_) * 0.33333334);
  local_3d8 = fVar270 * auVar190._0_4_ + fVar182 * auVar130._0_4_;
  fStack_3d4 = fVar150 * auVar190._4_4_ + fVar196 * auVar130._4_4_;
  fStack_3d0 = fVar180 * auVar190._8_4_ + fVar197 * auVar130._8_4_;
  fStack_3cc = fVar181 * auVar190._12_4_ + fVar198 * auVar130._12_4_;
  local_428 = (auVar252._0_4_ + auVar155._0_4_) * fVar270 + fVar182 * (float)local_4d8._0_4_;
  fStack_424 = (auVar252._4_4_ + auVar155._4_4_) * fVar150 + fVar196 * (float)local_4d8._4_4_;
  fStack_420 = (auVar252._8_4_ + auVar155._8_4_) * fVar180 + fVar197 * fStack_4d0;
  fStack_41c = (auVar252._12_4_ + auVar155._12_4_) * fVar181 + fVar198 * fStack_4cc;
  aVar10 = (ray->org).field_0;
  auVar176 = vsubps_avx(_local_378,(undefined1  [16])aVar10);
  auVar190 = vmovsldup_avx(auVar176);
  auVar96 = vmovshdup_avx(auVar176);
  auVar176 = vshufps_avx(auVar176,auVar176,0xaa);
  fVar270 = (pre->ray_space).vx.field_0.m128[0];
  fVar150 = (pre->ray_space).vx.field_0.m128[1];
  fVar180 = (pre->ray_space).vx.field_0.m128[2];
  fVar181 = (pre->ray_space).vx.field_0.m128[3];
  fVar182 = (pre->ray_space).vy.field_0.m128[0];
  fVar196 = (pre->ray_space).vy.field_0.m128[1];
  fVar197 = (pre->ray_space).vy.field_0.m128[2];
  fVar198 = (pre->ray_space).vy.field_0.m128[3];
  fVar199 = (pre->ray_space).vz.field_0.m128[0];
  fVar224 = (pre->ray_space).vz.field_0.m128[1];
  fVar225 = (pre->ray_space).vz.field_0.m128[2];
  fVar226 = (pre->ray_space).vz.field_0.m128[3];
  local_4e8._0_4_ = fVar270 * auVar190._0_4_ + fVar182 * auVar96._0_4_ + fVar199 * auVar176._0_4_;
  local_4e8._4_4_ = fVar150 * auVar190._4_4_ + fVar196 * auVar96._4_4_ + fVar224 * auVar176._4_4_;
  fStack_4e0 = fVar180 * auVar190._8_4_ + fVar197 * auVar96._8_4_ + fVar225 * auVar176._8_4_;
  fStack_4dc = fVar181 * auVar190._12_4_ + fVar198 * auVar96._12_4_ + fVar226 * auVar176._12_4_;
  auVar176 = vsubps_avx(_local_388,(undefined1  [16])aVar10);
  auVar190 = vmovsldup_avx(auVar176);
  auVar96 = vmovshdup_avx(auVar176);
  auVar176 = vshufps_avx(auVar176,auVar176,0xaa);
  auVar331._0_8_ =
       CONCAT44(fVar150 * auVar190._4_4_ + fVar196 * auVar96._4_4_ + fVar224 * auVar176._4_4_,
                fVar270 * auVar190._0_4_ + fVar182 * auVar96._0_4_ + fVar199 * auVar176._0_4_);
  auVar331._8_4_ = fVar180 * auVar190._8_4_ + fVar197 * auVar96._8_4_ + fVar225 * auVar176._8_4_;
  auVar331._12_4_ = fVar181 * auVar190._12_4_ + fVar198 * auVar96._12_4_ + fVar226 * auVar176._12_4_
  ;
  auVar190 = vsubps_avx(_local_398,(undefined1  [16])aVar10);
  auVar176 = vshufps_avx(auVar190,auVar190,0xaa);
  auVar96 = vmovshdup_avx(auVar190);
  auVar190 = vmovsldup_avx(auVar190);
  auVar127._0_8_ =
       CONCAT44(fVar150 * auVar190._4_4_ + auVar96._4_4_ * fVar196 + fVar224 * auVar176._4_4_,
                fVar270 * auVar190._0_4_ + auVar96._0_4_ * fVar182 + fVar199 * auVar176._0_4_);
  auVar127._8_4_ = fVar180 * auVar190._8_4_ + auVar96._8_4_ * fVar197 + fVar225 * auVar176._8_4_;
  auVar127._12_4_ = fVar181 * auVar190._12_4_ + auVar96._12_4_ * fVar198 + fVar226 * auVar176._12_4_
  ;
  auVar190 = vsubps_avx(_local_3a8,(undefined1  [16])aVar10);
  auVar176 = vshufps_avx(auVar190,auVar190,0xaa);
  auVar96 = vmovshdup_avx(auVar190);
  auVar190 = vmovsldup_avx(auVar190);
  auVar265._0_8_ =
       CONCAT44(auVar96._4_4_ * fVar196 + auVar176._4_4_ * fVar224 + fVar150 * auVar190._4_4_,
                auVar96._0_4_ * fVar182 + auVar176._0_4_ * fVar199 + fVar270 * auVar190._0_4_);
  auVar265._8_4_ = auVar96._8_4_ * fVar197 + auVar176._8_4_ * fVar225 + fVar180 * auVar190._8_4_;
  auVar265._12_4_ = auVar96._12_4_ * fVar198 + auVar176._12_4_ * fVar226 + fVar181 * auVar190._12_4_
  ;
  auVar190 = vsubps_avx(_local_3b8,(undefined1  [16])aVar10);
  auVar176 = vshufps_avx(auVar190,auVar190,0xaa);
  auVar96 = vmovshdup_avx(auVar190);
  auVar190 = vmovsldup_avx(auVar190);
  auVar283._0_8_ =
       CONCAT44(auVar190._4_4_ * fVar150 + auVar96._4_4_ * fVar196 + auVar176._4_4_ * fVar224,
                auVar190._0_4_ * fVar270 + auVar96._0_4_ * fVar182 + auVar176._0_4_ * fVar199);
  auVar283._8_4_ = auVar190._8_4_ * fVar180 + auVar96._8_4_ * fVar197 + auVar176._8_4_ * fVar225;
  auVar283._12_4_ = auVar190._12_4_ * fVar181 + auVar96._12_4_ * fVar198 + auVar176._12_4_ * fVar226
  ;
  auVar190 = vsubps_avx(_local_3c8,(undefined1  [16])aVar10);
  auVar176 = vshufps_avx(auVar190,auVar190,0xaa);
  auVar96 = vmovshdup_avx(auVar190);
  auVar190 = vmovsldup_avx(auVar190);
  auVar290._0_8_ =
       CONCAT44(auVar190._4_4_ * fVar150 + auVar96._4_4_ * fVar196 + auVar176._4_4_ * fVar224,
                auVar190._0_4_ * fVar270 + auVar96._0_4_ * fVar182 + auVar176._0_4_ * fVar199);
  auVar290._8_4_ = auVar190._8_4_ * fVar180 + auVar96._8_4_ * fVar197 + auVar176._8_4_ * fVar225;
  auVar290._12_4_ = auVar190._12_4_ * fVar181 + auVar96._12_4_ * fVar198 + auVar176._12_4_ * fVar226
  ;
  auVar62._4_4_ = fStack_3d4;
  auVar62._0_4_ = local_3d8;
  auVar62._8_4_ = fStack_3d0;
  auVar62._12_4_ = fStack_3cc;
  auVar190 = vsubps_avx(auVar62,(undefined1  [16])aVar10);
  auVar176 = vshufps_avx(auVar190,auVar190,0xaa);
  auVar96 = vmovshdup_avx(auVar190);
  auVar190 = vmovsldup_avx(auVar190);
  auVar303._0_8_ =
       CONCAT44(auVar190._4_4_ * fVar150 + auVar96._4_4_ * fVar196 + auVar176._4_4_ * fVar224,
                auVar190._0_4_ * fVar270 + auVar96._0_4_ * fVar182 + auVar176._0_4_ * fVar199);
  auVar303._8_4_ = auVar190._8_4_ * fVar180 + auVar96._8_4_ * fVar197 + auVar176._8_4_ * fVar225;
  auVar303._12_4_ = auVar190._12_4_ * fVar181 + auVar96._12_4_ * fVar198 + auVar176._12_4_ * fVar226
  ;
  auVar59._4_4_ = fStack_424;
  auVar59._0_4_ = local_428;
  auVar59._8_4_ = fStack_420;
  auVar59._12_4_ = fStack_41c;
  auVar190 = vsubps_avx(auVar59,(undefined1  [16])aVar10);
  auVar176 = vshufps_avx(auVar190,auVar190,0xaa);
  auVar96 = vmovshdup_avx(auVar190);
  auVar190 = vmovsldup_avx(auVar190);
  auVar90._0_8_ =
       CONCAT44(fVar150 * auVar190._4_4_ + auVar96._4_4_ * fVar196 + auVar176._4_4_ * fVar224,
                fVar270 * auVar190._0_4_ + auVar96._0_4_ * fVar182 + auVar176._0_4_ * fVar199);
  auVar90._8_4_ = fVar180 * auVar190._8_4_ + auVar96._8_4_ * fVar197 + auVar176._8_4_ * fVar225;
  auVar90._12_4_ = fVar181 * auVar190._12_4_ + auVar96._12_4_ * fVar198 + auVar176._12_4_ * fVar226;
  _local_448 = vmovlhps_avx(_local_4e8,auVar283);
  _local_458 = vmovlhps_avx(auVar331,auVar290);
  _local_468 = vmovlhps_avx(auVar127,auVar303);
  _local_298 = vmovlhps_avx(auVar265,auVar90);
  auVar96 = vminps_avx(_local_448,_local_458);
  auVar190 = vminps_avx(_local_468,_local_298);
  auVar176 = vminps_avx(auVar96,auVar190);
  auVar96 = vmaxps_avx(_local_448,_local_458);
  auVar190 = vmaxps_avx(_local_468,_local_298);
  auVar96 = vmaxps_avx(auVar96,auVar190);
  auVar190 = vshufpd_avx(auVar176,auVar176,3);
  auVar176 = vminps_avx(auVar176,auVar190);
  auVar190 = vshufpd_avx(auVar96,auVar96,3);
  auVar190 = vmaxps_avx(auVar96,auVar190);
  auVar253._8_4_ = 0x7fffffff;
  auVar253._0_8_ = 0x7fffffff7fffffff;
  auVar253._12_4_ = 0x7fffffff;
  auVar96 = vandps_avx(auVar176,auVar253);
  auVar190 = vandps_avx(auVar190,auVar253);
  auVar96 = vmaxps_avx(auVar96,auVar190);
  auVar190 = vmovshdup_avx(auVar96);
  auVar96 = vmaxss_avx(auVar190,auVar96);
  auVar73 = (undefined1  [8])((ulong)uVar65 + 0xf);
  fVar270 = auVar96._0_4_ * 9.536743e-07;
  register0x00001388 = auVar331._0_8_;
  local_498 = auVar331._0_8_;
  register0x00001548 = auVar127._0_8_;
  local_318 = auVar127._0_8_;
  register0x000013c8 = auVar265._0_8_;
  local_328 = auVar265._0_8_;
  register0x00001408 = auVar283._0_8_;
  local_338 = auVar283._0_8_;
  register0x00001448 = auVar290._0_8_;
  local_348 = auVar290._0_8_;
  register0x00001488 = auVar303._0_8_;
  local_358 = auVar303._0_8_;
  register0x00001588 = auVar90._0_8_;
  local_368 = auVar90._0_8_;
  local_2a8 = ZEXT416((uint)fVar270);
  auVar96 = vshufps_avx(local_2a8,ZEXT416((uint)fVar270),0);
  local_198._16_16_ = auVar96;
  local_198._0_16_ = auVar96;
  auVar91._0_8_ = auVar96._0_8_ ^ 0x8000000080000000;
  auVar91._8_4_ = auVar96._8_4_ ^ 0x80000000;
  auVar91._12_4_ = auVar96._12_4_ ^ 0x80000000;
  local_1b8._16_16_ = auVar91;
  local_1b8._0_16_ = auVar91;
  bVar71 = false;
  uVar66 = 0;
  _local_1c8 = vsubps_avx(_local_458,_local_448);
  _local_1d8 = vsubps_avx(_local_468,_local_458);
  _local_1e8 = vsubps_avx(_local_298,_local_468);
  _local_218 = vsubps_avx(_local_3b8,_local_378);
  _local_228 = vsubps_avx(_local_3c8,_local_388);
  _local_238 = vsubps_avx(auVar62,_local_398);
  auVar60._4_4_ = fStack_424;
  auVar60._0_4_ = local_428;
  auVar60._8_4_ = fStack_420;
  auVar60._12_4_ = fStack_41c;
  _local_248 = vsubps_avx(auVar60,_local_3a8);
  auVar92 = ZEXT816(0x3f80000000000000);
  auVar96 = auVar92;
LAB_00f239e6:
  do {
    local_1f8 = auVar96;
    auVar190 = vshufps_avx(auVar92,auVar92,0x50);
    auVar340._8_4_ = 0x3f800000;
    auVar340._0_8_ = 0x3f8000003f800000;
    auVar340._12_4_ = 0x3f800000;
    auVar344._16_4_ = 0x3f800000;
    auVar344._0_16_ = auVar340;
    auVar344._20_4_ = 0x3f800000;
    auVar344._24_4_ = 0x3f800000;
    auVar344._28_4_ = 0x3f800000;
    auVar176 = vsubps_avx(auVar340,auVar190);
    fVar270 = auVar190._0_4_;
    fVar150 = auVar190._4_4_;
    fVar180 = auVar190._8_4_;
    fVar181 = auVar190._12_4_;
    fVar182 = auVar176._0_4_;
    fVar196 = auVar176._4_4_;
    fVar197 = auVar176._8_4_;
    fVar198 = auVar176._12_4_;
    auVar192._0_4_ = local_338._0_4_ * fVar270 + fVar182 * (float)local_4e8._0_4_;
    auVar192._4_4_ = local_338._4_4_ * fVar150 + fVar196 * (float)local_4e8._4_4_;
    auVar192._8_4_ = local_338._8_4_ * fVar180 + fVar197 * (float)local_4e8._0_4_;
    auVar192._12_4_ = local_338._12_4_ * fVar181 + fVar198 * (float)local_4e8._4_4_;
    auVar162._0_4_ = local_348._0_4_ * fVar270 + fVar182 * local_498._0_4_;
    auVar162._4_4_ = local_348._4_4_ * fVar150 + fVar196 * local_498._4_4_;
    auVar162._8_4_ = local_348._8_4_ * fVar180 + fVar197 * local_498._8_4_;
    auVar162._12_4_ = local_348._12_4_ * fVar181 + fVar198 * local_498._12_4_;
    auVar266._0_4_ = local_358._0_4_ * fVar270 + fVar182 * local_318._0_4_;
    auVar266._4_4_ = local_358._4_4_ * fVar150 + fVar196 * local_318._4_4_;
    auVar266._8_4_ = local_358._8_4_ * fVar180 + fVar197 * local_318._8_4_;
    auVar266._12_4_ = local_358._12_4_ * fVar181 + fVar198 * local_318._12_4_;
    auVar210._0_4_ = local_368._0_4_ * fVar270 + local_328._0_4_ * fVar182;
    auVar210._4_4_ = local_368._4_4_ * fVar150 + local_328._4_4_ * fVar196;
    auVar210._8_4_ = local_368._8_4_ * fVar180 + local_328._8_4_ * fVar197;
    auVar210._12_4_ = local_368._12_4_ * fVar181 + local_328._12_4_ * fVar198;
    auVar190 = vmovshdup_avx(auVar96);
    auVar176 = vshufps_avx(auVar96,auVar96,0);
    auVar296._16_16_ = auVar176;
    auVar296._0_16_ = auVar176;
    auVar141 = vshufps_avx(auVar96,auVar96,0x55);
    auVar109._16_16_ = auVar141;
    auVar109._0_16_ = auVar141;
    auVar108 = vsubps_avx(auVar109,auVar296);
    auVar141 = vshufps_avx(auVar192,auVar192,0);
    auVar130 = vshufps_avx(auVar192,auVar192,0x55);
    auVar166 = vshufps_avx(auVar162,auVar162,0);
    auVar131 = vshufps_avx(auVar162,auVar162,0x55);
    auVar257 = vshufps_avx(auVar266,auVar266,0);
    auVar18 = vshufps_avx(auVar266,auVar266,0x55);
    auVar19 = vshufps_avx(auVar210,auVar210,0);
    auVar279 = vshufps_avx(auVar210,auVar210,0x55);
    auVar190 = ZEXT416((uint)((auVar190._0_4_ - auVar96._0_4_) * 0.04761905));
    auVar190 = vshufps_avx(auVar190,auVar190,0);
    auVar306._0_4_ = auVar176._0_4_ + auVar108._0_4_ * 0.0;
    auVar306._4_4_ = auVar176._4_4_ + auVar108._4_4_ * 0.14285715;
    auVar306._8_4_ = auVar176._8_4_ + auVar108._8_4_ * 0.2857143;
    auVar306._12_4_ = auVar176._12_4_ + auVar108._12_4_ * 0.42857146;
    auVar306._16_4_ = auVar176._0_4_ + auVar108._16_4_ * 0.5714286;
    auVar306._20_4_ = auVar176._4_4_ + auVar108._20_4_ * 0.71428573;
    auVar306._24_4_ = auVar176._8_4_ + auVar108._24_4_ * 0.8571429;
    auVar306._28_4_ = auVar176._12_4_ + auVar108._28_4_;
    auVar21 = vsubps_avx(auVar344,auVar306);
    fVar270 = auVar166._0_4_;
    fVar180 = auVar166._4_4_;
    fVar182 = auVar166._8_4_;
    fVar197 = auVar166._12_4_;
    fVar319 = auVar21._0_4_;
    fVar321 = auVar21._4_4_;
    fVar326 = auVar21._8_4_;
    fVar327 = auVar21._12_4_;
    fVar328 = auVar21._16_4_;
    fVar329 = auVar21._20_4_;
    fVar334 = auVar21._24_4_;
    fVar116 = auVar131._0_4_;
    fVar298 = auVar131._4_4_;
    fVar300 = auVar131._8_4_;
    fVar315 = auVar131._12_4_;
    fVar318 = auVar130._12_4_ + 1.0;
    fVar227 = auVar257._0_4_;
    fVar75 = auVar257._4_4_;
    fVar114 = auVar257._8_4_;
    fVar115 = auVar257._12_4_;
    fVar199 = fVar227 * auVar306._0_4_ + fVar319 * fVar270;
    fVar224 = fVar75 * auVar306._4_4_ + fVar321 * fVar180;
    fVar225 = fVar114 * auVar306._8_4_ + fVar326 * fVar182;
    fVar226 = fVar115 * auVar306._12_4_ + fVar327 * fVar197;
    fVar228 = fVar227 * auVar306._16_4_ + fVar328 * fVar270;
    fVar246 = fVar75 * auVar306._20_4_ + fVar329 * fVar180;
    fVar247 = fVar114 * auVar306._24_4_ + fVar334 * fVar182;
    fVar150 = auVar18._0_4_;
    fVar181 = auVar18._4_4_;
    fVar196 = auVar18._8_4_;
    fVar198 = auVar18._12_4_;
    fVar288 = fVar116 * fVar319 + auVar306._0_4_ * fVar150;
    fVar299 = fVar298 * fVar321 + auVar306._4_4_ * fVar181;
    fVar307 = fVar300 * fVar326 + auVar306._8_4_ * fVar196;
    fVar317 = fVar315 * fVar327 + auVar306._12_4_ * fVar198;
    fVar335 = fVar116 * fVar328 + auVar306._16_4_ * fVar150;
    fVar336 = fVar298 * fVar329 + auVar306._20_4_ * fVar181;
    fVar308 = fVar300 * fVar334 + auVar306._24_4_ * fVar196;
    fVar316 = fVar315 + fVar197;
    auVar176 = vshufps_avx(auVar192,auVar192,0xaa);
    auVar166 = vshufps_avx(auVar192,auVar192,0xff);
    fVar248 = fVar115 + 0.0;
    auVar131 = vshufps_avx(auVar162,auVar162,0xaa);
    auVar257 = vshufps_avx(auVar162,auVar162,0xff);
    auVar222._0_4_ =
         fVar319 * (auVar306._0_4_ * fVar270 + fVar319 * auVar141._0_4_) + auVar306._0_4_ * fVar199;
    auVar222._4_4_ =
         fVar321 * (auVar306._4_4_ * fVar180 + fVar321 * auVar141._4_4_) + auVar306._4_4_ * fVar224;
    auVar222._8_4_ =
         fVar326 * (auVar306._8_4_ * fVar182 + fVar326 * auVar141._8_4_) + auVar306._8_4_ * fVar225;
    auVar222._12_4_ =
         fVar327 * (auVar306._12_4_ * fVar197 + fVar327 * auVar141._12_4_) +
         auVar306._12_4_ * fVar226;
    auVar222._16_4_ =
         fVar328 * (auVar306._16_4_ * fVar270 + fVar328 * auVar141._0_4_) +
         auVar306._16_4_ * fVar228;
    auVar222._20_4_ =
         fVar329 * (auVar306._20_4_ * fVar180 + fVar329 * auVar141._4_4_) +
         auVar306._20_4_ * fVar246;
    auVar222._24_4_ =
         fVar334 * (auVar306._24_4_ * fVar182 + fVar334 * auVar141._8_4_) +
         auVar306._24_4_ * fVar247;
    auVar222._28_4_ = auVar141._12_4_ + 1.0 + fVar198;
    auVar244._0_4_ =
         fVar319 * (fVar116 * auVar306._0_4_ + auVar130._0_4_ * fVar319) + auVar306._0_4_ * fVar288;
    auVar244._4_4_ =
         fVar321 * (fVar298 * auVar306._4_4_ + auVar130._4_4_ * fVar321) + auVar306._4_4_ * fVar299;
    auVar244._8_4_ =
         fVar326 * (fVar300 * auVar306._8_4_ + auVar130._8_4_ * fVar326) + auVar306._8_4_ * fVar307;
    auVar244._12_4_ =
         fVar327 * (fVar315 * auVar306._12_4_ + auVar130._12_4_ * fVar327) +
         auVar306._12_4_ * fVar317;
    auVar244._16_4_ =
         fVar328 * (fVar116 * auVar306._16_4_ + auVar130._0_4_ * fVar328) +
         auVar306._16_4_ * fVar335;
    auVar244._20_4_ =
         fVar329 * (fVar298 * auVar306._20_4_ + auVar130._4_4_ * fVar329) +
         auVar306._20_4_ * fVar336;
    auVar244._24_4_ =
         fVar334 * (fVar300 * auVar306._24_4_ + auVar130._8_4_ * fVar334) +
         auVar306._24_4_ * fVar308;
    auVar244._28_4_ = auVar279._12_4_ + fVar198;
    auVar110._0_4_ =
         fVar319 * fVar199 + auVar306._0_4_ * (fVar227 * fVar319 + auVar19._0_4_ * auVar306._0_4_);
    auVar110._4_4_ =
         fVar321 * fVar224 + auVar306._4_4_ * (fVar75 * fVar321 + auVar19._4_4_ * auVar306._4_4_);
    auVar110._8_4_ =
         fVar326 * fVar225 + auVar306._8_4_ * (fVar114 * fVar326 + auVar19._8_4_ * auVar306._8_4_);
    auVar110._12_4_ =
         fVar327 * fVar226 +
         auVar306._12_4_ * (fVar115 * fVar327 + auVar19._12_4_ * auVar306._12_4_);
    auVar110._16_4_ =
         fVar328 * fVar228 + auVar306._16_4_ * (fVar227 * fVar328 + auVar19._0_4_ * auVar306._16_4_)
    ;
    auVar110._20_4_ =
         fVar329 * fVar246 + auVar306._20_4_ * (fVar75 * fVar329 + auVar19._4_4_ * auVar306._20_4_);
    auVar110._24_4_ =
         fVar334 * fVar247 + auVar306._24_4_ * (fVar114 * fVar334 + auVar19._8_4_ * auVar306._24_4_)
    ;
    auVar110._28_4_ = fVar197 + 1.0 + fVar248;
    auVar314._0_4_ =
         fVar319 * fVar288 + auVar306._0_4_ * (auVar279._0_4_ * auVar306._0_4_ + fVar319 * fVar150);
    auVar314._4_4_ =
         fVar321 * fVar299 + auVar306._4_4_ * (auVar279._4_4_ * auVar306._4_4_ + fVar321 * fVar181);
    auVar314._8_4_ =
         fVar326 * fVar307 + auVar306._8_4_ * (auVar279._8_4_ * auVar306._8_4_ + fVar326 * fVar196);
    auVar314._12_4_ =
         fVar327 * fVar317 +
         auVar306._12_4_ * (auVar279._12_4_ * auVar306._12_4_ + fVar327 * fVar198);
    auVar314._16_4_ =
         fVar328 * fVar335 +
         auVar306._16_4_ * (auVar279._0_4_ * auVar306._16_4_ + fVar328 * fVar150);
    auVar314._20_4_ =
         fVar329 * fVar336 +
         auVar306._20_4_ * (auVar279._4_4_ * auVar306._20_4_ + fVar329 * fVar181);
    auVar314._24_4_ =
         fVar334 * fVar308 +
         auVar306._24_4_ * (auVar279._8_4_ * auVar306._24_4_ + fVar334 * fVar196);
    auVar314._28_4_ = fVar248 + fVar198 + 0.0;
    local_98._0_4_ = fVar319 * auVar222._0_4_ + auVar306._0_4_ * auVar110._0_4_;
    local_98._4_4_ = fVar321 * auVar222._4_4_ + auVar306._4_4_ * auVar110._4_4_;
    local_98._8_4_ = fVar326 * auVar222._8_4_ + auVar306._8_4_ * auVar110._8_4_;
    local_98._12_4_ = fVar327 * auVar222._12_4_ + auVar306._12_4_ * auVar110._12_4_;
    local_98._16_4_ = fVar328 * auVar222._16_4_ + auVar306._16_4_ * auVar110._16_4_;
    local_98._20_4_ = fVar329 * auVar222._20_4_ + auVar306._20_4_ * auVar110._20_4_;
    local_98._24_4_ = fVar334 * auVar222._24_4_ + auVar306._24_4_ * auVar110._24_4_;
    local_98._28_4_ = fVar316 + fVar198 + 0.0;
    auVar195._0_4_ = fVar319 * auVar244._0_4_ + auVar306._0_4_ * auVar314._0_4_;
    auVar195._4_4_ = fVar321 * auVar244._4_4_ + auVar306._4_4_ * auVar314._4_4_;
    auVar195._8_4_ = fVar326 * auVar244._8_4_ + auVar306._8_4_ * auVar314._8_4_;
    auVar195._12_4_ = fVar327 * auVar244._12_4_ + auVar306._12_4_ * auVar314._12_4_;
    auVar195._16_4_ = fVar328 * auVar244._16_4_ + auVar306._16_4_ * auVar314._16_4_;
    auVar195._20_4_ = fVar329 * auVar244._20_4_ + auVar306._20_4_ * auVar314._20_4_;
    auVar195._24_4_ = fVar334 * auVar244._24_4_ + auVar306._24_4_ * auVar314._24_4_;
    auVar195._28_4_ = fVar316 + fVar248;
    auVar22 = vsubps_avx(auVar110,auVar222);
    auVar108 = vsubps_avx(auVar314,auVar244);
    local_418._0_4_ = auVar190._0_4_;
    local_418._4_4_ = auVar190._4_4_;
    fStack_410 = auVar190._8_4_;
    fStack_40c = auVar190._12_4_;
    local_d8 = (float)local_418._0_4_ * auVar22._0_4_ * 3.0;
    fStack_d4 = (float)local_418._4_4_ * auVar22._4_4_ * 3.0;
    auVar23._4_4_ = fStack_d4;
    auVar23._0_4_ = local_d8;
    fStack_d0 = fStack_410 * auVar22._8_4_ * 3.0;
    auVar23._8_4_ = fStack_d0;
    fStack_cc = fStack_40c * auVar22._12_4_ * 3.0;
    auVar23._12_4_ = fStack_cc;
    fStack_c8 = (float)local_418._0_4_ * auVar22._16_4_ * 3.0;
    auVar23._16_4_ = fStack_c8;
    fStack_c4 = (float)local_418._4_4_ * auVar22._20_4_ * 3.0;
    auVar23._20_4_ = fStack_c4;
    fStack_c0 = fStack_410 * auVar22._24_4_ * 3.0;
    auVar23._24_4_ = fStack_c0;
    auVar23._28_4_ = auVar22._28_4_;
    local_f8 = (float)local_418._0_4_ * auVar108._0_4_ * 3.0;
    fStack_f4 = (float)local_418._4_4_ * auVar108._4_4_ * 3.0;
    auVar24._4_4_ = fStack_f4;
    auVar24._0_4_ = local_f8;
    fStack_f0 = fStack_410 * auVar108._8_4_ * 3.0;
    auVar24._8_4_ = fStack_f0;
    fStack_ec = fStack_40c * auVar108._12_4_ * 3.0;
    auVar24._12_4_ = fStack_ec;
    fStack_e8 = (float)local_418._0_4_ * auVar108._16_4_ * 3.0;
    auVar24._16_4_ = fStack_e8;
    fStack_e4 = (float)local_418._4_4_ * auVar108._20_4_ * 3.0;
    auVar24._20_4_ = fStack_e4;
    fStack_e0 = fStack_410 * auVar108._24_4_ * 3.0;
    auVar24._24_4_ = fStack_e0;
    auVar24._28_4_ = fVar316;
    auVar23 = vsubps_avx(local_98,auVar23);
    auVar108 = vperm2f128_avx(auVar23,auVar23,1);
    auVar108 = vshufps_avx(auVar108,auVar23,0x30);
    auVar108 = vshufps_avx(auVar23,auVar108,0x29);
    auVar24 = vsubps_avx(auVar195,auVar24);
    auVar23 = vperm2f128_avx(auVar24,auVar24,1);
    auVar23 = vshufps_avx(auVar23,auVar24,0x30);
    _local_3f8 = vshufps_avx(auVar24,auVar23,0x29);
    fVar336 = auVar131._0_4_;
    fVar308 = auVar131._4_4_;
    fVar320 = auVar131._8_4_;
    fVar197 = auVar176._12_4_;
    fVar75 = auVar257._0_4_;
    fVar115 = auVar257._4_4_;
    fVar288 = auVar257._8_4_;
    fVar299 = auVar257._12_4_;
    auVar190 = vshufps_avx(auVar266,auVar266,0xaa);
    fVar270 = auVar190._0_4_;
    fVar180 = auVar190._4_4_;
    fVar182 = auVar190._8_4_;
    fVar198 = auVar190._12_4_;
    fVar225 = auVar306._0_4_ * fVar270 + fVar336 * fVar319;
    fVar226 = auVar306._4_4_ * fVar180 + fVar308 * fVar321;
    fVar228 = auVar306._8_4_ * fVar182 + fVar320 * fVar326;
    fVar246 = auVar306._12_4_ * fVar198 + auVar131._12_4_ * fVar327;
    fVar247 = auVar306._16_4_ * fVar270 + fVar336 * fVar328;
    fVar248 = auVar306._20_4_ * fVar180 + fVar308 * fVar329;
    fVar227 = auVar306._24_4_ * fVar182 + fVar320 * fVar334;
    auVar190 = vshufps_avx(auVar266,auVar266,0xff);
    fVar150 = auVar190._0_4_;
    fVar181 = auVar190._4_4_;
    fVar196 = auVar190._8_4_;
    fVar199 = auVar190._12_4_;
    fVar114 = auVar306._0_4_ * fVar150 + fVar75 * fVar319;
    fVar116 = auVar306._4_4_ * fVar181 + fVar115 * fVar321;
    fVar298 = auVar306._8_4_ * fVar196 + fVar288 * fVar326;
    fVar300 = auVar306._12_4_ * fVar199 + fVar299 * fVar327;
    fVar307 = auVar306._16_4_ * fVar150 + fVar75 * fVar328;
    fVar315 = auVar306._20_4_ * fVar181 + fVar115 * fVar329;
    fVar317 = auVar306._24_4_ * fVar196 + fVar288 * fVar334;
    auVar190 = vshufps_avx(auVar210,auVar210,0xaa);
    fVar335 = auVar190._12_4_ + fVar198;
    auVar141 = vshufps_avx(auVar210,auVar210,0xff);
    fVar224 = auVar141._12_4_;
    auVar111._0_4_ =
         fVar319 * (fVar336 * auVar306._0_4_ + fVar319 * auVar176._0_4_) + auVar306._0_4_ * fVar225;
    auVar111._4_4_ =
         fVar321 * (fVar308 * auVar306._4_4_ + fVar321 * auVar176._4_4_) + auVar306._4_4_ * fVar226;
    auVar111._8_4_ =
         fVar326 * (fVar320 * auVar306._8_4_ + fVar326 * auVar176._8_4_) + auVar306._8_4_ * fVar228;
    auVar111._12_4_ =
         fVar327 * (auVar131._12_4_ * auVar306._12_4_ + fVar327 * fVar197) +
         auVar306._12_4_ * fVar246;
    auVar111._16_4_ =
         fVar328 * (fVar336 * auVar306._16_4_ + fVar328 * auVar176._0_4_) +
         auVar306._16_4_ * fVar247;
    auVar111._20_4_ =
         fVar329 * (fVar308 * auVar306._20_4_ + fVar329 * auVar176._4_4_) +
         auVar306._20_4_ * fVar248;
    auVar111._24_4_ =
         fVar334 * (fVar320 * auVar306._24_4_ + fVar334 * auVar176._8_4_) +
         auVar306._24_4_ * fVar227;
    auVar111._28_4_ = local_3f8._28_4_ + fVar197 + fVar224;
    auVar146._0_4_ =
         fVar319 * (fVar75 * auVar306._0_4_ + auVar166._0_4_ * fVar319) + auVar306._0_4_ * fVar114;
    auVar146._4_4_ =
         fVar321 * (fVar115 * auVar306._4_4_ + auVar166._4_4_ * fVar321) + auVar306._4_4_ * fVar116;
    auVar146._8_4_ =
         fVar326 * (fVar288 * auVar306._8_4_ + auVar166._8_4_ * fVar326) + auVar306._8_4_ * fVar298;
    auVar146._12_4_ =
         fVar327 * (fVar299 * auVar306._12_4_ + auVar166._12_4_ * fVar327) +
         auVar306._12_4_ * fVar300;
    auVar146._16_4_ =
         fVar328 * (fVar75 * auVar306._16_4_ + auVar166._0_4_ * fVar328) + auVar306._16_4_ * fVar307
    ;
    auVar146._20_4_ =
         fVar329 * (fVar115 * auVar306._20_4_ + auVar166._4_4_ * fVar329) +
         auVar306._20_4_ * fVar315;
    auVar146._24_4_ =
         fVar334 * (fVar288 * auVar306._24_4_ + auVar166._8_4_ * fVar334) +
         auVar306._24_4_ * fVar317;
    auVar146._28_4_ = fVar197 + auVar23._28_4_ + fVar224;
    auVar23 = vperm2f128_avx(local_98,local_98,1);
    auVar23 = vshufps_avx(auVar23,local_98,0x30);
    _local_308 = vshufps_avx(local_98,auVar23,0x29);
    auVar245._0_4_ =
         auVar306._0_4_ * (auVar190._0_4_ * auVar306._0_4_ + fVar319 * fVar270) + fVar319 * fVar225;
    auVar245._4_4_ =
         auVar306._4_4_ * (auVar190._4_4_ * auVar306._4_4_ + fVar321 * fVar180) + fVar321 * fVar226;
    auVar245._8_4_ =
         auVar306._8_4_ * (auVar190._8_4_ * auVar306._8_4_ + fVar326 * fVar182) + fVar326 * fVar228;
    auVar245._12_4_ =
         auVar306._12_4_ * (auVar190._12_4_ * auVar306._12_4_ + fVar327 * fVar198) +
         fVar327 * fVar246;
    auVar245._16_4_ =
         auVar306._16_4_ * (auVar190._0_4_ * auVar306._16_4_ + fVar328 * fVar270) +
         fVar328 * fVar247;
    auVar245._20_4_ =
         auVar306._20_4_ * (auVar190._4_4_ * auVar306._20_4_ + fVar329 * fVar180) +
         fVar329 * fVar248;
    auVar245._24_4_ =
         auVar306._24_4_ * (auVar190._8_4_ * auVar306._24_4_ + fVar334 * fVar182) +
         fVar334 * fVar227;
    auVar245._28_4_ = fVar335 + fVar318 + auVar244._28_4_;
    auVar287._0_4_ =
         fVar319 * fVar114 + auVar306._0_4_ * (auVar306._0_4_ * auVar141._0_4_ + fVar319 * fVar150);
    auVar287._4_4_ =
         fVar321 * fVar116 + auVar306._4_4_ * (auVar306._4_4_ * auVar141._4_4_ + fVar321 * fVar181);
    auVar287._8_4_ =
         fVar326 * fVar298 + auVar306._8_4_ * (auVar306._8_4_ * auVar141._8_4_ + fVar326 * fVar196);
    auVar287._12_4_ =
         fVar327 * fVar300 + auVar306._12_4_ * (auVar306._12_4_ * fVar224 + fVar327 * fVar199);
    auVar287._16_4_ =
         fVar328 * fVar307 +
         auVar306._16_4_ * (auVar306._16_4_ * auVar141._0_4_ + fVar328 * fVar150);
    auVar287._20_4_ =
         fVar329 * fVar315 +
         auVar306._20_4_ * (auVar306._20_4_ * auVar141._4_4_ + fVar329 * fVar181);
    auVar287._24_4_ =
         fVar334 * fVar317 +
         auVar306._24_4_ * (auVar306._24_4_ * auVar141._8_4_ + fVar334 * fVar196);
    auVar287._28_4_ = fVar318 + fVar299 + fVar224 + fVar199;
    auVar269._0_4_ = fVar319 * auVar111._0_4_ + auVar306._0_4_ * auVar245._0_4_;
    auVar269._4_4_ = fVar321 * auVar111._4_4_ + auVar306._4_4_ * auVar245._4_4_;
    auVar269._8_4_ = fVar326 * auVar111._8_4_ + auVar306._8_4_ * auVar245._8_4_;
    auVar269._12_4_ = fVar327 * auVar111._12_4_ + auVar306._12_4_ * auVar245._12_4_;
    auVar269._16_4_ = fVar328 * auVar111._16_4_ + auVar306._16_4_ * auVar245._16_4_;
    auVar269._20_4_ = fVar329 * auVar111._20_4_ + auVar306._20_4_ * auVar245._20_4_;
    auVar269._24_4_ = fVar334 * auVar111._24_4_ + auVar306._24_4_ * auVar245._24_4_;
    auVar269._28_4_ = fVar335 + fVar224 + fVar199;
    auVar297._0_4_ = fVar319 * auVar146._0_4_ + auVar306._0_4_ * auVar287._0_4_;
    auVar297._4_4_ = fVar321 * auVar146._4_4_ + auVar306._4_4_ * auVar287._4_4_;
    auVar297._8_4_ = fVar326 * auVar146._8_4_ + auVar306._8_4_ * auVar287._8_4_;
    auVar297._12_4_ = fVar327 * auVar146._12_4_ + auVar306._12_4_ * auVar287._12_4_;
    auVar297._16_4_ = fVar328 * auVar146._16_4_ + auVar306._16_4_ * auVar287._16_4_;
    auVar297._20_4_ = fVar329 * auVar146._20_4_ + auVar306._20_4_ * auVar287._20_4_;
    auVar297._24_4_ = fVar334 * auVar146._24_4_ + auVar306._24_4_ * auVar287._24_4_;
    auVar297._28_4_ = auVar21._28_4_ + auVar306._28_4_;
    auVar21 = vsubps_avx(auVar245,auVar111);
    auVar23 = vsubps_avx(auVar287,auVar146);
    local_118 = (float)local_418._0_4_ * auVar21._0_4_ * 3.0;
    fStack_114 = (float)local_418._4_4_ * auVar21._4_4_ * 3.0;
    auVar25._4_4_ = fStack_114;
    auVar25._0_4_ = local_118;
    fStack_110 = fStack_410 * auVar21._8_4_ * 3.0;
    auVar25._8_4_ = fStack_110;
    fStack_10c = fStack_40c * auVar21._12_4_ * 3.0;
    auVar25._12_4_ = fStack_10c;
    fStack_108 = (float)local_418._0_4_ * auVar21._16_4_ * 3.0;
    auVar25._16_4_ = fStack_108;
    fStack_104 = (float)local_418._4_4_ * auVar21._20_4_ * 3.0;
    auVar25._20_4_ = fStack_104;
    fStack_100 = fStack_410 * auVar21._24_4_ * 3.0;
    auVar25._24_4_ = fStack_100;
    auVar25._28_4_ = auVar21._28_4_;
    local_138 = (float)local_418._0_4_ * auVar23._0_4_ * 3.0;
    fStack_134 = (float)local_418._4_4_ * auVar23._4_4_ * 3.0;
    auVar26._4_4_ = fStack_134;
    auVar26._0_4_ = local_138;
    fStack_130 = fStack_410 * auVar23._8_4_ * 3.0;
    auVar26._8_4_ = fStack_130;
    fStack_12c = fStack_40c * auVar23._12_4_ * 3.0;
    auVar26._12_4_ = fStack_12c;
    fStack_128 = (float)local_418._0_4_ * auVar23._16_4_ * 3.0;
    auVar26._16_4_ = fStack_128;
    fStack_124 = (float)local_418._4_4_ * auVar23._20_4_ * 3.0;
    auVar26._20_4_ = fStack_124;
    fStack_120 = fStack_410 * auVar23._24_4_ * 3.0;
    auVar26._24_4_ = fStack_120;
    auVar26._28_4_ = auVar245._28_4_;
    auVar23 = vperm2f128_avx(auVar269,auVar269,1);
    auVar23 = vshufps_avx(auVar23,auVar269,0x30);
    auVar109 = vshufps_avx(auVar269,auVar23,0x29);
    auVar24 = vsubps_avx(auVar269,auVar25);
    auVar23 = vperm2f128_avx(auVar24,auVar24,1);
    auVar23 = vshufps_avx(auVar23,auVar24,0x30);
    _local_418 = vshufps_avx(auVar24,auVar23,0x29);
    auVar24 = vsubps_avx(auVar297,auVar26);
    auVar23 = vperm2f128_avx(auVar24,auVar24,1);
    auVar23 = vshufps_avx(auVar23,auVar24,0x30);
    _local_488 = vshufps_avx(auVar24,auVar23,0x29);
    auVar24 = vsubps_avx(auVar269,local_98);
    auVar25 = vsubps_avx(auVar109,_local_308);
    fVar270 = auVar25._0_4_ + auVar24._0_4_;
    fVar150 = auVar25._4_4_ + auVar24._4_4_;
    fVar180 = auVar25._8_4_ + auVar24._8_4_;
    fVar181 = auVar25._12_4_ + auVar24._12_4_;
    fVar182 = auVar25._16_4_ + auVar24._16_4_;
    fVar196 = auVar25._20_4_ + auVar24._20_4_;
    fVar197 = auVar25._24_4_ + auVar24._24_4_;
    auVar23 = vperm2f128_avx(auVar195,auVar195,1);
    auVar23 = vshufps_avx(auVar23,auVar195,0x30);
    local_b8 = vshufps_avx(auVar195,auVar23,0x29);
    auVar23 = vperm2f128_avx(auVar297,auVar297,1);
    auVar23 = vshufps_avx(auVar23,auVar297,0x30);
    local_78 = vshufps_avx(auVar297,auVar23,0x29);
    auVar23 = vsubps_avx(auVar297,auVar195);
    auVar26 = vsubps_avx(local_78,local_b8);
    fVar198 = auVar26._0_4_ + auVar23._0_4_;
    fVar199 = auVar26._4_4_ + auVar23._4_4_;
    fVar224 = auVar26._8_4_ + auVar23._8_4_;
    fVar225 = auVar26._12_4_ + auVar23._12_4_;
    fVar226 = auVar26._16_4_ + auVar23._16_4_;
    fVar228 = auVar26._20_4_ + auVar23._20_4_;
    fVar246 = auVar26._24_4_ + auVar23._24_4_;
    auVar27._4_4_ = fVar150 * auVar195._4_4_;
    auVar27._0_4_ = fVar270 * auVar195._0_4_;
    auVar27._8_4_ = fVar180 * auVar195._8_4_;
    auVar27._12_4_ = fVar181 * auVar195._12_4_;
    auVar27._16_4_ = fVar182 * auVar195._16_4_;
    auVar27._20_4_ = fVar196 * auVar195._20_4_;
    auVar27._24_4_ = fVar197 * auVar195._24_4_;
    auVar27._28_4_ = auVar23._28_4_;
    auVar28._4_4_ = fVar199 * local_98._4_4_;
    auVar28._0_4_ = fVar198 * local_98._0_4_;
    auVar28._8_4_ = fVar224 * local_98._8_4_;
    auVar28._12_4_ = fVar225 * local_98._12_4_;
    auVar28._16_4_ = fVar226 * local_98._16_4_;
    auVar28._20_4_ = fVar228 * local_98._20_4_;
    auVar28._24_4_ = fVar246 * local_98._24_4_;
    auVar28._28_4_ = fVar335;
    auVar27 = vsubps_avx(auVar27,auVar28);
    local_d8 = local_98._0_4_ + local_d8;
    fStack_d4 = local_98._4_4_ + fStack_d4;
    fStack_d0 = local_98._8_4_ + fStack_d0;
    fStack_cc = local_98._12_4_ + fStack_cc;
    fStack_c8 = local_98._16_4_ + fStack_c8;
    fStack_c4 = local_98._20_4_ + fStack_c4;
    fStack_c0 = local_98._24_4_ + fStack_c0;
    fStack_bc = local_98._28_4_ + auVar22._28_4_;
    local_f8 = local_f8 + auVar195._0_4_;
    fStack_f4 = fStack_f4 + auVar195._4_4_;
    fStack_f0 = fStack_f0 + auVar195._8_4_;
    fStack_ec = fStack_ec + auVar195._12_4_;
    fStack_e8 = fStack_e8 + auVar195._16_4_;
    fStack_e4 = fStack_e4 + auVar195._20_4_;
    fStack_e0 = fStack_e0 + auVar195._24_4_;
    fStack_dc = fVar316 + auVar195._28_4_;
    auVar22._4_4_ = fVar150 * fStack_f4;
    auVar22._0_4_ = fVar270 * local_f8;
    auVar22._8_4_ = fVar180 * fStack_f0;
    auVar22._12_4_ = fVar181 * fStack_ec;
    auVar22._16_4_ = fVar182 * fStack_e8;
    auVar22._20_4_ = fVar196 * fStack_e4;
    auVar22._24_4_ = fVar197 * fStack_e0;
    auVar22._28_4_ = fVar316;
    auVar29._4_4_ = fVar199 * fStack_d4;
    auVar29._0_4_ = fVar198 * local_d8;
    auVar29._8_4_ = fVar224 * fStack_d0;
    auVar29._12_4_ = fVar225 * fStack_cc;
    auVar29._16_4_ = fVar226 * fStack_c8;
    auVar29._20_4_ = fVar228 * fStack_c4;
    auVar29._24_4_ = fVar246 * fStack_c0;
    auVar29._28_4_ = fVar316 + auVar195._28_4_;
    auVar22 = vsubps_avx(auVar22,auVar29);
    auVar30._4_4_ = fVar150 * (float)local_3f8._4_4_;
    auVar30._0_4_ = fVar270 * (float)local_3f8._0_4_;
    auVar30._8_4_ = fVar180 * fStack_3f0;
    auVar30._12_4_ = fVar181 * fStack_3ec;
    auVar30._16_4_ = fVar182 * fStack_3e8;
    auVar30._20_4_ = fVar196 * fStack_3e4;
    auVar30._24_4_ = fVar197 * fStack_3e0;
    auVar30._28_4_ = fVar316;
    local_4b8._0_4_ = auVar108._0_4_;
    local_4b8._4_4_ = auVar108._4_4_;
    fStack_4b0 = auVar108._8_4_;
    fStack_4ac = auVar108._12_4_;
    fStack_4a8 = auVar108._16_4_;
    fStack_4a4 = auVar108._20_4_;
    fStack_4a0 = auVar108._24_4_;
    auVar31._4_4_ = fVar199 * (float)local_4b8._4_4_;
    auVar31._0_4_ = fVar198 * (float)local_4b8._0_4_;
    auVar31._8_4_ = fVar224 * fStack_4b0;
    auVar31._12_4_ = fVar225 * fStack_4ac;
    auVar31._16_4_ = fVar226 * fStack_4a8;
    auVar31._20_4_ = fVar228 * fStack_4a4;
    auVar31._24_4_ = fVar246 * fStack_4a0;
    auVar31._28_4_ = local_98._28_4_;
    auVar28 = vsubps_avx(auVar30,auVar31);
    auVar32._4_4_ = local_b8._4_4_ * fVar150;
    auVar32._0_4_ = local_b8._0_4_ * fVar270;
    auVar32._8_4_ = local_b8._8_4_ * fVar180;
    auVar32._12_4_ = local_b8._12_4_ * fVar181;
    auVar32._16_4_ = local_b8._16_4_ * fVar182;
    auVar32._20_4_ = local_b8._20_4_ * fVar196;
    auVar32._24_4_ = local_b8._24_4_ * fVar197;
    auVar32._28_4_ = fVar316;
    auVar33._4_4_ = local_308._4_4_ * fVar199;
    auVar33._0_4_ = local_308._0_4_ * fVar198;
    auVar33._8_4_ = local_308._8_4_ * fVar224;
    auVar33._12_4_ = local_308._12_4_ * fVar225;
    auVar33._16_4_ = local_308._16_4_ * fVar226;
    auVar33._20_4_ = local_308._20_4_ * fVar228;
    auVar33._24_4_ = local_308._24_4_ * fVar246;
    auVar33._28_4_ = local_b8._28_4_;
    auVar29 = vsubps_avx(auVar32,auVar33);
    auVar34._4_4_ = auVar297._4_4_ * fVar150;
    auVar34._0_4_ = auVar297._0_4_ * fVar270;
    auVar34._8_4_ = auVar297._8_4_ * fVar180;
    auVar34._12_4_ = auVar297._12_4_ * fVar181;
    auVar34._16_4_ = auVar297._16_4_ * fVar182;
    auVar34._20_4_ = auVar297._20_4_ * fVar196;
    auVar34._24_4_ = auVar297._24_4_ * fVar197;
    auVar34._28_4_ = fVar316;
    auVar35._4_4_ = fVar199 * auVar269._4_4_;
    auVar35._0_4_ = fVar198 * auVar269._0_4_;
    auVar35._8_4_ = fVar224 * auVar269._8_4_;
    auVar35._12_4_ = fVar225 * auVar269._12_4_;
    auVar35._16_4_ = fVar226 * auVar269._16_4_;
    auVar35._20_4_ = fVar228 * auVar269._20_4_;
    auVar35._24_4_ = fVar246 * auVar269._24_4_;
    auVar35._28_4_ = fStack_bc;
    auVar30 = vsubps_avx(auVar34,auVar35);
    local_118 = auVar269._0_4_ + local_118;
    fStack_114 = auVar269._4_4_ + fStack_114;
    fStack_110 = auVar269._8_4_ + fStack_110;
    fStack_10c = auVar269._12_4_ + fStack_10c;
    fStack_108 = auVar269._16_4_ + fStack_108;
    fStack_104 = auVar269._20_4_ + fStack_104;
    fStack_100 = auVar269._24_4_ + fStack_100;
    fStack_fc = auVar269._28_4_ + auVar21._28_4_;
    local_138 = auVar297._0_4_ + local_138;
    fStack_134 = auVar297._4_4_ + fStack_134;
    fStack_130 = auVar297._8_4_ + fStack_130;
    fStack_12c = auVar297._12_4_ + fStack_12c;
    fStack_128 = auVar297._16_4_ + fStack_128;
    fStack_124 = auVar297._20_4_ + fStack_124;
    fStack_120 = auVar297._24_4_ + fStack_120;
    fStack_11c = auVar297._28_4_ + auVar245._28_4_;
    auVar21._4_4_ = fVar150 * fStack_134;
    auVar21._0_4_ = fVar270 * local_138;
    auVar21._8_4_ = fVar180 * fStack_130;
    auVar21._12_4_ = fVar181 * fStack_12c;
    auVar21._16_4_ = fVar182 * fStack_128;
    auVar21._20_4_ = fVar196 * fStack_124;
    auVar21._24_4_ = fVar197 * fStack_120;
    auVar21._28_4_ = auVar297._28_4_ + auVar245._28_4_;
    auVar36._4_4_ = fStack_114 * fVar199;
    auVar36._0_4_ = local_118 * fVar198;
    auVar36._8_4_ = fStack_110 * fVar224;
    auVar36._12_4_ = fStack_10c * fVar225;
    auVar36._16_4_ = fStack_108 * fVar226;
    auVar36._20_4_ = fStack_104 * fVar228;
    auVar36._24_4_ = fStack_100 * fVar246;
    auVar36._28_4_ = fStack_fc;
    auVar31 = vsubps_avx(auVar21,auVar36);
    auVar37._4_4_ = fVar150 * local_488._4_4_;
    auVar37._0_4_ = fVar270 * local_488._0_4_;
    auVar37._8_4_ = fVar180 * local_488._8_4_;
    auVar37._12_4_ = fVar181 * local_488._12_4_;
    auVar37._16_4_ = fVar182 * local_488._16_4_;
    auVar37._20_4_ = fVar196 * local_488._20_4_;
    auVar37._24_4_ = fVar197 * local_488._24_4_;
    auVar37._28_4_ = fStack_fc;
    auVar38._4_4_ = fVar199 * (float)local_418._4_4_;
    auVar38._0_4_ = fVar198 * (float)local_418._0_4_;
    auVar38._8_4_ = fVar224 * fStack_410;
    auVar38._12_4_ = fVar225 * fStack_40c;
    auVar38._16_4_ = fVar226 * fStack_408;
    auVar38._20_4_ = fVar228 * fStack_404;
    auVar38._24_4_ = fVar246 * fStack_400;
    auVar38._28_4_ = local_488._28_4_;
    auVar32 = vsubps_avx(auVar37,auVar38);
    auVar39._4_4_ = fVar150 * local_78._4_4_;
    auVar39._0_4_ = fVar270 * local_78._0_4_;
    auVar39._8_4_ = fVar180 * local_78._8_4_;
    auVar39._12_4_ = fVar181 * local_78._12_4_;
    auVar39._16_4_ = fVar182 * local_78._16_4_;
    auVar39._20_4_ = fVar196 * local_78._20_4_;
    auVar39._24_4_ = fVar197 * local_78._24_4_;
    auVar39._28_4_ = auVar25._28_4_ + auVar24._28_4_;
    auVar40._4_4_ = auVar109._4_4_ * fVar199;
    auVar40._0_4_ = auVar109._0_4_ * fVar198;
    auVar40._8_4_ = auVar109._8_4_ * fVar224;
    auVar40._12_4_ = auVar109._12_4_ * fVar225;
    auVar40._16_4_ = auVar109._16_4_ * fVar226;
    auVar40._20_4_ = auVar109._20_4_ * fVar228;
    auVar40._24_4_ = auVar109._24_4_ * fVar246;
    auVar40._28_4_ = auVar26._28_4_ + auVar23._28_4_;
    auVar25 = vsubps_avx(auVar39,auVar40);
    auVar23 = vminps_avx(auVar27,auVar22);
    auVar108 = vmaxps_avx(auVar27,auVar22);
    auVar21 = vminps_avx(auVar28,auVar29);
    auVar21 = vminps_avx(auVar23,auVar21);
    auVar23 = vmaxps_avx(auVar28,auVar29);
    auVar108 = vmaxps_avx(auVar108,auVar23);
    auVar22 = vminps_avx(auVar30,auVar31);
    auVar23 = vmaxps_avx(auVar30,auVar31);
    auVar24 = vminps_avx(auVar32,auVar25);
    auVar24 = vminps_avx(auVar22,auVar24);
    auVar24 = vminps_avx(auVar21,auVar24);
    auVar21 = vmaxps_avx(auVar32,auVar25);
    auVar23 = vmaxps_avx(auVar23,auVar21);
    auVar23 = vmaxps_avx(auVar108,auVar23);
    auVar108 = vcmpps_avx(auVar24,local_198,2);
    auVar23 = vcmpps_avx(auVar23,local_1b8,5);
    auVar108 = vandps_avx(auVar23,auVar108);
    auVar23 = local_158 & auVar108;
    if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar23 >> 0x7f,0) != '\0') ||
          (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar23 >> 0xbf,0) != '\0') ||
        (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar23[0x1f] < '\0')
    {
      auVar23 = vsubps_avx(_local_308,local_98);
      auVar21 = vsubps_avx(auVar109,auVar269);
      fVar150 = auVar23._0_4_ + auVar21._0_4_;
      fVar180 = auVar23._4_4_ + auVar21._4_4_;
      fVar181 = auVar23._8_4_ + auVar21._8_4_;
      fVar182 = auVar23._12_4_ + auVar21._12_4_;
      fVar196 = auVar23._16_4_ + auVar21._16_4_;
      fVar197 = auVar23._20_4_ + auVar21._20_4_;
      fVar198 = auVar23._24_4_ + auVar21._24_4_;
      auVar24 = vsubps_avx(local_b8,auVar195);
      auVar25 = vsubps_avx(local_78,auVar297);
      fVar199 = auVar24._0_4_ + auVar25._0_4_;
      fVar224 = auVar24._4_4_ + auVar25._4_4_;
      fVar225 = auVar24._8_4_ + auVar25._8_4_;
      fVar226 = auVar24._12_4_ + auVar25._12_4_;
      fVar228 = auVar24._16_4_ + auVar25._16_4_;
      fVar246 = auVar24._20_4_ + auVar25._20_4_;
      fVar247 = auVar24._24_4_ + auVar25._24_4_;
      fVar270 = auVar25._28_4_;
      auVar41._4_4_ = auVar195._4_4_ * fVar180;
      auVar41._0_4_ = auVar195._0_4_ * fVar150;
      auVar41._8_4_ = auVar195._8_4_ * fVar181;
      auVar41._12_4_ = auVar195._12_4_ * fVar182;
      auVar41._16_4_ = auVar195._16_4_ * fVar196;
      auVar41._20_4_ = auVar195._20_4_ * fVar197;
      auVar41._24_4_ = auVar195._24_4_ * fVar198;
      auVar41._28_4_ = auVar195._28_4_;
      auVar42._4_4_ = local_98._4_4_ * fVar224;
      auVar42._0_4_ = local_98._0_4_ * fVar199;
      auVar42._8_4_ = local_98._8_4_ * fVar225;
      auVar42._12_4_ = local_98._12_4_ * fVar226;
      auVar42._16_4_ = local_98._16_4_ * fVar228;
      auVar42._20_4_ = local_98._20_4_ * fVar246;
      auVar42._24_4_ = local_98._24_4_ * fVar247;
      auVar42._28_4_ = local_98._28_4_;
      auVar25 = vsubps_avx(auVar41,auVar42);
      auVar43._4_4_ = fVar180 * fStack_f4;
      auVar43._0_4_ = fVar150 * local_f8;
      auVar43._8_4_ = fVar181 * fStack_f0;
      auVar43._12_4_ = fVar182 * fStack_ec;
      auVar43._16_4_ = fVar196 * fStack_e8;
      auVar43._20_4_ = fVar197 * fStack_e4;
      auVar43._24_4_ = fVar198 * fStack_e0;
      auVar43._28_4_ = auVar195._28_4_;
      auVar44._4_4_ = fVar224 * fStack_d4;
      auVar44._0_4_ = fVar199 * local_d8;
      auVar44._8_4_ = fVar225 * fStack_d0;
      auVar44._12_4_ = fVar226 * fStack_cc;
      auVar44._16_4_ = fVar228 * fStack_c8;
      auVar44._20_4_ = fVar246 * fStack_c4;
      auVar44._24_4_ = fVar247 * fStack_c0;
      auVar44._28_4_ = fVar270;
      auVar26 = vsubps_avx(auVar43,auVar44);
      auVar45._4_4_ = fVar180 * (float)local_3f8._4_4_;
      auVar45._0_4_ = fVar150 * (float)local_3f8._0_4_;
      auVar45._8_4_ = fVar181 * fStack_3f0;
      auVar45._12_4_ = fVar182 * fStack_3ec;
      auVar45._16_4_ = fVar196 * fStack_3e8;
      auVar45._20_4_ = fVar197 * fStack_3e4;
      auVar45._24_4_ = fVar198 * fStack_3e0;
      auVar45._28_4_ = fVar270;
      auVar46._4_4_ = fVar224 * (float)local_4b8._4_4_;
      auVar46._0_4_ = fVar199 * (float)local_4b8._0_4_;
      auVar46._8_4_ = fVar225 * fStack_4b0;
      auVar46._12_4_ = fVar226 * fStack_4ac;
      auVar46._16_4_ = fVar228 * fStack_4a8;
      auVar46._20_4_ = fVar246 * fStack_4a4;
      auVar46._24_4_ = fVar247 * fStack_4a0;
      auVar46._28_4_ = auVar22._28_4_;
      auVar27 = vsubps_avx(auVar45,auVar46);
      auVar47._4_4_ = local_b8._4_4_ * fVar180;
      auVar47._0_4_ = local_b8._0_4_ * fVar150;
      auVar47._8_4_ = local_b8._8_4_ * fVar181;
      auVar47._12_4_ = local_b8._12_4_ * fVar182;
      auVar47._16_4_ = local_b8._16_4_ * fVar196;
      auVar47._20_4_ = local_b8._20_4_ * fVar197;
      auVar47._24_4_ = local_b8._24_4_ * fVar198;
      auVar47._28_4_ = auVar22._28_4_;
      auVar48._4_4_ = local_308._4_4_ * fVar224;
      auVar48._0_4_ = local_308._0_4_ * fVar199;
      auVar48._8_4_ = local_308._8_4_ * fVar225;
      auVar48._12_4_ = local_308._12_4_ * fVar226;
      auVar48._16_4_ = local_308._16_4_ * fVar228;
      auVar48._20_4_ = local_308._20_4_ * fVar246;
      uVar8 = local_308._28_4_;
      auVar48._24_4_ = local_308._24_4_ * fVar247;
      auVar48._28_4_ = uVar8;
      auVar28 = vsubps_avx(auVar47,auVar48);
      auVar49._4_4_ = auVar297._4_4_ * fVar180;
      auVar49._0_4_ = auVar297._0_4_ * fVar150;
      auVar49._8_4_ = auVar297._8_4_ * fVar181;
      auVar49._12_4_ = auVar297._12_4_ * fVar182;
      auVar49._16_4_ = auVar297._16_4_ * fVar196;
      auVar49._20_4_ = auVar297._20_4_ * fVar197;
      auVar49._24_4_ = auVar297._24_4_ * fVar198;
      auVar49._28_4_ = uVar8;
      auVar50._4_4_ = auVar269._4_4_ * fVar224;
      auVar50._0_4_ = auVar269._0_4_ * fVar199;
      auVar50._8_4_ = auVar269._8_4_ * fVar225;
      auVar50._12_4_ = auVar269._12_4_ * fVar226;
      auVar50._16_4_ = auVar269._16_4_ * fVar228;
      auVar50._20_4_ = auVar269._20_4_ * fVar246;
      auVar50._24_4_ = auVar269._24_4_ * fVar247;
      auVar50._28_4_ = auVar269._28_4_;
      auVar29 = vsubps_avx(auVar49,auVar50);
      auVar51._4_4_ = fVar180 * fStack_134;
      auVar51._0_4_ = fVar150 * local_138;
      auVar51._8_4_ = fVar181 * fStack_130;
      auVar51._12_4_ = fVar182 * fStack_12c;
      auVar51._16_4_ = fVar196 * fStack_128;
      auVar51._20_4_ = fVar197 * fStack_124;
      auVar51._24_4_ = fVar198 * fStack_120;
      auVar51._28_4_ = uVar8;
      auVar52._4_4_ = fVar224 * fStack_114;
      auVar52._0_4_ = fVar199 * local_118;
      auVar52._8_4_ = fVar225 * fStack_110;
      auVar52._12_4_ = fVar226 * fStack_10c;
      auVar52._16_4_ = fVar228 * fStack_108;
      auVar52._20_4_ = fVar246 * fStack_104;
      auVar52._24_4_ = fVar247 * fStack_100;
      auVar52._28_4_ = auVar297._28_4_;
      auVar30 = vsubps_avx(auVar51,auVar52);
      auVar53._4_4_ = fVar180 * local_488._4_4_;
      auVar53._0_4_ = fVar150 * local_488._0_4_;
      auVar53._8_4_ = fVar181 * local_488._8_4_;
      auVar53._12_4_ = fVar182 * local_488._12_4_;
      auVar53._16_4_ = fVar196 * local_488._16_4_;
      auVar53._20_4_ = fVar197 * local_488._20_4_;
      auVar53._24_4_ = fVar198 * local_488._24_4_;
      auVar53._28_4_ = auVar297._28_4_;
      auVar54._4_4_ = (float)local_418._4_4_ * fVar224;
      auVar54._0_4_ = (float)local_418._0_4_ * fVar199;
      auVar54._8_4_ = fStack_410 * fVar225;
      auVar54._12_4_ = fStack_40c * fVar226;
      auVar54._16_4_ = fStack_408 * fVar228;
      auVar54._20_4_ = fStack_404 * fVar246;
      auVar54._24_4_ = fStack_400 * fVar247;
      auVar54._28_4_ = local_b8._28_4_;
      auVar31 = vsubps_avx(auVar53,auVar54);
      auVar55._4_4_ = local_78._4_4_ * fVar180;
      auVar55._0_4_ = local_78._0_4_ * fVar150;
      auVar55._8_4_ = local_78._8_4_ * fVar181;
      auVar55._12_4_ = local_78._12_4_ * fVar182;
      auVar55._16_4_ = local_78._16_4_ * fVar196;
      auVar55._20_4_ = local_78._20_4_ * fVar197;
      auVar55._24_4_ = local_78._24_4_ * fVar198;
      auVar55._28_4_ = auVar23._28_4_ + auVar21._28_4_;
      auVar56._4_4_ = auVar109._4_4_ * fVar224;
      auVar56._0_4_ = auVar109._0_4_ * fVar199;
      auVar56._8_4_ = auVar109._8_4_ * fVar225;
      auVar56._12_4_ = auVar109._12_4_ * fVar226;
      auVar56._16_4_ = auVar109._16_4_ * fVar228;
      auVar56._20_4_ = auVar109._20_4_ * fVar246;
      auVar56._24_4_ = auVar109._24_4_ * fVar247;
      auVar56._28_4_ = auVar24._28_4_ + fVar270;
      auVar32 = vsubps_avx(auVar55,auVar56);
      auVar21 = vminps_avx(auVar25,auVar26);
      auVar23 = vmaxps_avx(auVar25,auVar26);
      auVar22 = vminps_avx(auVar27,auVar28);
      auVar22 = vminps_avx(auVar21,auVar22);
      auVar21 = vmaxps_avx(auVar27,auVar28);
      auVar23 = vmaxps_avx(auVar23,auVar21);
      auVar24 = vminps_avx(auVar29,auVar30);
      auVar21 = vmaxps_avx(auVar29,auVar30);
      auVar109 = vminps_avx(auVar31,auVar32);
      auVar24 = vminps_avx(auVar24,auVar109);
      auVar24 = vminps_avx(auVar22,auVar24);
      auVar22 = vmaxps_avx(auVar31,auVar32);
      auVar21 = vmaxps_avx(auVar21,auVar22);
      auVar21 = vmaxps_avx(auVar23,auVar21);
      auVar23 = vcmpps_avx(auVar24,local_198,2);
      auVar21 = vcmpps_avx(auVar21,local_1b8,5);
      auVar23 = vandps_avx(auVar21,auVar23);
      auVar108 = vandps_avx(local_158,auVar108);
      auVar21 = auVar108 & auVar23;
      if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar21 >> 0x7f,0) != '\0') ||
            (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar21 >> 0xbf,0) != '\0') ||
          (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar21[0x1f] < '\0') {
        auVar108 = vandps_avx(auVar23,auVar108);
        uVar72 = vmovmskps_avx(auVar108);
        if (uVar72 != 0) {
          auStack_288[uVar66] = uVar72 & 0xff;
          uVar9 = vmovlps_avx(auVar96);
          *(undefined8 *)(afStack_178 + uVar66 * 2) = uVar9;
          uVar74 = vmovlps_avx(auVar92);
          auStack_58[uVar66] = uVar74;
          uVar66 = (ulong)((int)uVar66 + 1);
        }
      }
    }
LAB_00f2404d:
    do {
      do {
        do {
          do {
            if ((int)uVar66 == 0) {
              if (bVar71) {
                return bVar71;
              }
              fVar270 = ray->tfar;
              auVar107._4_4_ = fVar270;
              auVar107._0_4_ = fVar270;
              auVar107._8_4_ = fVar270;
              auVar107._12_4_ = fVar270;
              auVar96 = vcmpps_avx(local_208,auVar107,2);
              uVar72 = vmovmskps_avx(auVar96);
              uVar65 = uVar65 & SUB84(auVar73,0) & uVar72;
              if (uVar65 == 0) {
                return bVar71;
              }
              goto LAB_00f22e73;
            }
            uVar68 = (int)uVar66 - 1;
            uVar69 = (ulong)uVar68;
            uVar72 = auStack_288[uVar69];
            fVar270 = afStack_178[uVar69 * 2];
            fVar150 = afStack_178[uVar69 * 2 + 1];
            auVar92._8_8_ = 0;
            auVar92._0_8_ = auStack_58[uVar69];
            uVar74 = 0;
            if (uVar72 != 0) {
              for (; (uVar72 >> uVar74 & 1) == 0; uVar74 = uVar74 + 1) {
              }
            }
            uVar72 = uVar72 - 1 & uVar72;
            auStack_288[uVar69] = uVar72;
            if (uVar72 == 0) {
              uVar66 = (ulong)uVar68;
            }
            fVar181 = (float)(uVar74 + 1) * 0.14285715;
            fVar180 = (1.0 - (float)uVar74 * 0.14285715) * fVar270 +
                      fVar150 * (float)uVar74 * 0.14285715;
            fVar270 = (1.0 - fVar181) * fVar270 + fVar150 * fVar181;
            fVar150 = fVar270 - fVar180;
            if (0.16666667 <= fVar150) {
              auVar96 = vinsertps_avx(ZEXT416((uint)fVar180),ZEXT416((uint)fVar270),0x10);
              goto LAB_00f239e6;
            }
            auVar96 = vshufps_avx(auVar92,auVar92,0x50);
            auVar128._8_4_ = 0x3f800000;
            auVar128._0_8_ = 0x3f8000003f800000;
            auVar128._12_4_ = 0x3f800000;
            auVar190 = vsubps_avx(auVar128,auVar96);
            fVar181 = auVar96._0_4_;
            fVar182 = auVar96._4_4_;
            fVar196 = auVar96._8_4_;
            fVar197 = auVar96._12_4_;
            fVar198 = auVar190._0_4_;
            fVar199 = auVar190._4_4_;
            fVar224 = auVar190._8_4_;
            fVar225 = auVar190._12_4_;
            auVar163._0_4_ = fVar181 * (float)local_338._0_4_ + fVar198 * (float)local_4e8._0_4_;
            auVar163._4_4_ = fVar182 * (float)local_338._4_4_ + fVar199 * (float)local_4e8._4_4_;
            auVar163._8_4_ = fVar196 * fStack_330 + fVar224 * (float)local_4e8._0_4_;
            auVar163._12_4_ = fVar197 * fStack_32c + fVar225 * (float)local_4e8._4_4_;
            auVar211._0_4_ = fVar181 * (float)local_348._0_4_ + fVar198 * (float)local_498._0_4_;
            auVar211._4_4_ = fVar182 * (float)local_348._4_4_ + fVar199 * (float)local_498._4_4_;
            auVar211._8_4_ = fVar196 * fStack_340 + fVar224 * fStack_490;
            auVar211._12_4_ = fVar197 * fStack_33c + fVar225 * fStack_48c;
            auVar237._0_4_ = fVar181 * (float)local_358._0_4_ + fVar198 * (float)local_318._0_4_;
            auVar237._4_4_ = fVar182 * (float)local_358._4_4_ + fVar199 * (float)local_318._4_4_;
            auVar237._8_4_ = fVar196 * fStack_350 + fVar224 * fStack_310;
            auVar237._12_4_ = fVar197 * fStack_34c + fVar225 * fStack_30c;
            auVar93._0_4_ = fVar181 * (float)local_368._0_4_ + fVar198 * (float)local_328._0_4_;
            auVar93._4_4_ = fVar182 * (float)local_368._4_4_ + fVar199 * (float)local_328._4_4_;
            auVar93._8_4_ = fVar196 * fStack_360 + fVar224 * fStack_320;
            auVar93._12_4_ = fVar197 * fStack_35c + fVar225 * fStack_31c;
            auVar147._16_16_ = auVar163;
            auVar147._0_16_ = auVar163;
            auVar178._16_16_ = auVar211;
            auVar178._0_16_ = auVar211;
            auVar223._16_16_ = auVar237;
            auVar223._0_16_ = auVar237;
            _local_4b8 = ZEXT432((uint)fVar180);
            _local_3f8 = ZEXT416((uint)fVar270);
            auVar108 = ZEXT2032(CONCAT416(fVar270,ZEXT416((uint)fVar180)));
            auVar108 = vshufps_avx(auVar108,auVar108,0);
            auVar23 = vsubps_avx(auVar178,auVar147);
            fVar181 = auVar108._0_4_;
            fVar182 = auVar108._4_4_;
            fVar196 = auVar108._8_4_;
            fVar197 = auVar108._12_4_;
            fVar198 = auVar108._16_4_;
            fVar199 = auVar108._20_4_;
            fVar224 = auVar108._24_4_;
            auVar148._0_4_ = auVar163._0_4_ + auVar23._0_4_ * fVar181;
            auVar148._4_4_ = auVar163._4_4_ + auVar23._4_4_ * fVar182;
            auVar148._8_4_ = auVar163._8_4_ + auVar23._8_4_ * fVar196;
            auVar148._12_4_ = auVar163._12_4_ + auVar23._12_4_ * fVar197;
            auVar148._16_4_ = auVar163._0_4_ + auVar23._16_4_ * fVar198;
            auVar148._20_4_ = auVar163._4_4_ + auVar23._20_4_ * fVar199;
            auVar148._24_4_ = auVar163._8_4_ + auVar23._24_4_ * fVar224;
            auVar148._28_4_ = auVar163._12_4_ + auVar23._28_4_;
            auVar108 = vsubps_avx(auVar223,auVar178);
            auVar179._0_4_ = auVar211._0_4_ + auVar108._0_4_ * fVar181;
            auVar179._4_4_ = auVar211._4_4_ + auVar108._4_4_ * fVar182;
            auVar179._8_4_ = auVar211._8_4_ + auVar108._8_4_ * fVar196;
            auVar179._12_4_ = auVar211._12_4_ + auVar108._12_4_ * fVar197;
            auVar179._16_4_ = auVar211._0_4_ + auVar108._16_4_ * fVar198;
            auVar179._20_4_ = auVar211._4_4_ + auVar108._20_4_ * fVar199;
            auVar179._24_4_ = auVar211._8_4_ + auVar108._24_4_ * fVar224;
            auVar179._28_4_ = auVar211._12_4_ + auVar108._28_4_;
            auVar96 = vsubps_avx(auVar93,auVar237);
            auVar112._0_4_ = auVar237._0_4_ + auVar96._0_4_ * fVar181;
            auVar112._4_4_ = auVar237._4_4_ + auVar96._4_4_ * fVar182;
            auVar112._8_4_ = auVar237._8_4_ + auVar96._8_4_ * fVar196;
            auVar112._12_4_ = auVar237._12_4_ + auVar96._12_4_ * fVar197;
            auVar112._16_4_ = auVar237._0_4_ + auVar96._0_4_ * fVar198;
            auVar112._20_4_ = auVar237._4_4_ + auVar96._4_4_ * fVar199;
            auVar112._24_4_ = auVar237._8_4_ + auVar96._8_4_ * fVar224;
            auVar112._28_4_ = auVar237._12_4_ + auVar96._12_4_;
            auVar108 = vsubps_avx(auVar179,auVar148);
            auVar149._0_4_ = auVar148._0_4_ + fVar181 * auVar108._0_4_;
            auVar149._4_4_ = auVar148._4_4_ + fVar182 * auVar108._4_4_;
            auVar149._8_4_ = auVar148._8_4_ + fVar196 * auVar108._8_4_;
            auVar149._12_4_ = auVar148._12_4_ + fVar197 * auVar108._12_4_;
            auVar149._16_4_ = auVar148._16_4_ + fVar198 * auVar108._16_4_;
            auVar149._20_4_ = auVar148._20_4_ + fVar199 * auVar108._20_4_;
            auVar149._24_4_ = auVar148._24_4_ + fVar224 * auVar108._24_4_;
            auVar149._28_4_ = auVar148._28_4_ + auVar108._28_4_;
            auVar108 = vsubps_avx(auVar112,auVar179);
            auVar113._0_4_ = auVar179._0_4_ + fVar181 * auVar108._0_4_;
            auVar113._4_4_ = auVar179._4_4_ + fVar182 * auVar108._4_4_;
            auVar113._8_4_ = auVar179._8_4_ + fVar196 * auVar108._8_4_;
            auVar113._12_4_ = auVar179._12_4_ + fVar197 * auVar108._12_4_;
            auVar113._16_4_ = auVar179._16_4_ + fVar198 * auVar108._16_4_;
            auVar113._20_4_ = auVar179._20_4_ + fVar199 * auVar108._20_4_;
            auVar113._24_4_ = auVar179._24_4_ + fVar224 * auVar108._24_4_;
            auVar113._28_4_ = auVar179._28_4_ + auVar108._28_4_;
            auVar108 = vsubps_avx(auVar113,auVar149);
            auVar254._0_4_ = auVar149._0_4_ + fVar181 * auVar108._0_4_;
            auVar254._4_4_ = auVar149._4_4_ + fVar182 * auVar108._4_4_;
            auVar254._8_4_ = auVar149._8_4_ + fVar196 * auVar108._8_4_;
            auVar254._12_4_ = auVar149._12_4_ + fVar197 * auVar108._12_4_;
            auVar256._16_4_ = auVar149._16_4_ + fVar198 * auVar108._16_4_;
            auVar256._0_16_ = auVar254;
            auVar256._20_4_ = auVar149._20_4_ + fVar199 * auVar108._20_4_;
            auVar256._24_4_ = auVar149._24_4_ + fVar224 * auVar108._24_4_;
            auVar256._28_4_ = auVar149._28_4_ + auVar179._28_4_;
            auVar257 = auVar256._16_16_;
            auVar130 = vshufps_avx(ZEXT416((uint)(fVar150 * 0.33333334)),
                                   ZEXT416((uint)(fVar150 * 0.33333334)),0);
            auVar238._0_4_ = auVar254._0_4_ + auVar130._0_4_ * auVar108._0_4_ * 3.0;
            auVar238._4_4_ = auVar254._4_4_ + auVar130._4_4_ * auVar108._4_4_ * 3.0;
            auVar238._8_4_ = auVar254._8_4_ + auVar130._8_4_ * auVar108._8_4_ * 3.0;
            auVar238._12_4_ = auVar254._12_4_ + auVar130._12_4_ * auVar108._12_4_ * 3.0;
            auVar176 = vshufpd_avx(auVar254,auVar254,3);
            auVar141 = vshufpd_avx(auVar257,auVar257,3);
            _local_308 = auVar176;
            auVar96 = vsubps_avx(auVar176,auVar254);
            _local_488 = auVar141;
            auVar190 = vsubps_avx(auVar141,auVar257);
            auVar94._0_4_ = auVar96._0_4_ + auVar190._0_4_;
            auVar94._4_4_ = auVar96._4_4_ + auVar190._4_4_;
            auVar94._8_4_ = auVar96._8_4_ + auVar190._8_4_;
            auVar94._12_4_ = auVar96._12_4_ + auVar190._12_4_;
            auVar96 = vmovshdup_avx(auVar254);
            auVar190 = vmovshdup_avx(auVar238);
            auVar166 = vshufps_avx(auVar94,auVar94,0);
            auVar131 = vshufps_avx(auVar94,auVar94,0x55);
            fVar181 = auVar131._0_4_;
            fVar182 = auVar131._4_4_;
            fVar196 = auVar131._8_4_;
            fVar197 = auVar131._12_4_;
            fVar198 = auVar166._0_4_;
            fVar199 = auVar166._4_4_;
            fVar224 = auVar166._8_4_;
            fVar225 = auVar166._12_4_;
            auVar95._0_4_ = fVar198 * auVar254._0_4_ + auVar96._0_4_ * fVar181;
            auVar95._4_4_ = fVar199 * auVar254._4_4_ + auVar96._4_4_ * fVar182;
            auVar95._8_4_ = fVar224 * auVar254._8_4_ + auVar96._8_4_ * fVar196;
            auVar95._12_4_ = fVar225 * auVar254._12_4_ + auVar96._12_4_ * fVar197;
            _local_418 = auVar238;
            auVar164._0_4_ = fVar198 * auVar238._0_4_ + auVar190._0_4_ * fVar181;
            auVar164._4_4_ = fVar199 * auVar238._4_4_ + auVar190._4_4_ * fVar182;
            auVar164._8_4_ = fVar224 * auVar238._8_4_ + auVar190._8_4_ * fVar196;
            auVar164._12_4_ = fVar225 * auVar238._12_4_ + auVar190._12_4_ * fVar197;
            auVar190 = vshufps_avx(auVar95,auVar95,0xe8);
            auVar166 = vshufps_avx(auVar164,auVar164,0xe8);
            auVar96 = vcmpps_avx(auVar190,auVar166,1);
            uVar72 = vextractps_avx(auVar96,0);
            auVar131 = auVar164;
            if ((uVar72 & 1) == 0) {
              auVar131 = auVar95;
            }
            auVar129._0_4_ = auVar130._0_4_ * auVar108._16_4_ * 3.0;
            auVar129._4_4_ = auVar130._4_4_ * auVar108._20_4_ * 3.0;
            auVar129._8_4_ = auVar130._8_4_ * auVar108._24_4_ * 3.0;
            auVar129._12_4_ = auVar130._12_4_ * 0.0;
            auVar19 = vsubps_avx(auVar257,auVar129);
            auVar130 = vmovshdup_avx(auVar19);
            auVar257 = vmovshdup_avx(auVar257);
            fVar226 = auVar19._0_4_;
            fVar228 = auVar19._4_4_;
            auVar212._0_4_ = fVar226 * fVar198 + auVar130._0_4_ * fVar181;
            auVar212._4_4_ = fVar228 * fVar199 + auVar130._4_4_ * fVar182;
            auVar212._8_4_ = auVar19._8_4_ * fVar224 + auVar130._8_4_ * fVar196;
            auVar212._12_4_ = auVar19._12_4_ * fVar225 + auVar130._12_4_ * fVar197;
            auVar239._0_4_ = fVar198 * auVar256._16_4_ + auVar257._0_4_ * fVar181;
            auVar239._4_4_ = fVar199 * auVar256._20_4_ + auVar257._4_4_ * fVar182;
            auVar239._8_4_ = fVar224 * auVar256._24_4_ + auVar257._8_4_ * fVar196;
            auVar239._12_4_ = fVar225 * auVar256._28_4_ + auVar257._12_4_ * fVar197;
            auVar257 = vshufps_avx(auVar212,auVar212,0xe8);
            auVar18 = vshufps_avx(auVar239,auVar239,0xe8);
            auVar130 = vcmpps_avx(auVar257,auVar18,1);
            uVar72 = vextractps_avx(auVar130,0);
            auVar279 = auVar239;
            if ((uVar72 & 1) == 0) {
              auVar279 = auVar212;
            }
            auVar131 = vmaxss_avx(auVar279,auVar131);
            auVar190 = vminps_avx(auVar190,auVar166);
            auVar166 = vminps_avx(auVar257,auVar18);
            auVar166 = vminps_avx(auVar190,auVar166);
            auVar96 = vshufps_avx(auVar96,auVar96,0x55);
            auVar96 = vblendps_avx(auVar96,auVar130,2);
            auVar130 = vpslld_avx(auVar96,0x1f);
            auVar96 = vshufpd_avx(auVar164,auVar164,1);
            auVar96 = vinsertps_avx(auVar96,auVar239,0x9c);
            auVar190 = vshufpd_avx(auVar95,auVar95,1);
            auVar190 = vinsertps_avx(auVar190,auVar212,0x9c);
            auVar96 = vblendvps_avx(auVar190,auVar96,auVar130);
            auVar190 = vmovshdup_avx(auVar96);
            auVar96 = vmaxss_avx(auVar190,auVar96);
            fVar196 = auVar166._0_4_;
            auVar190 = vmovshdup_avx(auVar166);
            fVar182 = auVar96._0_4_;
            fVar197 = auVar190._0_4_;
            fVar181 = auVar131._0_4_;
            if ((fVar196 < 0.0001) && (-0.0001 < fVar182)) break;
            if ((fVar197 < 0.0001 && -0.0001 < fVar181) || (fVar196 < 0.0001 && -0.0001 < fVar181))
            break;
            auVar130 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar96,1);
            auVar190 = vcmpps_avx(auVar190,SUB6416(ZEXT464(0x38d1b717),0),1);
            auVar190 = vandps_avx(auVar190,auVar130);
          } while ((auVar190 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
          auVar130 = vcmpps_avx(auVar166,_DAT_01f7aa10,1);
          auVar190 = vcmpss_avx(auVar131,ZEXT416(0),1);
          auVar165._8_4_ = 0x3f800000;
          auVar165._0_8_ = 0x3f8000003f800000;
          auVar165._12_4_ = 0x3f800000;
          auVar213._8_4_ = 0xbf800000;
          auVar213._0_8_ = 0xbf800000bf800000;
          auVar213._12_4_ = 0xbf800000;
          auVar190 = vblendvps_avx(auVar165,auVar213,auVar190);
          auVar130 = vblendvps_avx(auVar165,auVar213,auVar130);
          auVar166 = vcmpss_avx(auVar130,auVar190,4);
          auVar166 = vpshufd_avx(ZEXT416(auVar166._0_4_ & 1),0x50);
          auVar166 = vpslld_avx(auVar166,0x1f);
          auVar166 = vpsrad_avx(auVar166,0x1f);
          auVar166 = vpandn_avx(auVar166,_DAT_01fafeb0);
          auVar131 = vmovshdup_avx(auVar130);
          fVar198 = auVar131._0_4_;
          if ((auVar130._0_4_ != fVar198) || (NAN(auVar130._0_4_) || NAN(fVar198))) {
            if ((fVar197 != fVar196) || (NAN(fVar197) || NAN(fVar196))) {
              fVar196 = -fVar196 / (fVar197 - fVar196);
              auVar130 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar196) * 0.0 + fVar196)));
            }
            else {
              auVar130 = ZEXT816(0x3f80000000000000);
              if ((fVar196 != 0.0) || (NAN(fVar196))) {
                auVar130 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar257 = vcmpps_avx(auVar166,auVar130,1);
            auVar131 = vblendps_avx(auVar166,auVar130,2);
            auVar130 = vblendps_avx(auVar130,auVar166,2);
            auVar166 = vblendvps_avx(auVar130,auVar131,auVar257);
          }
          auVar96 = vcmpss_avx(auVar96,ZEXT416(0),1);
          auVar167._8_4_ = 0x3f800000;
          auVar167._0_8_ = 0x3f8000003f800000;
          auVar167._12_4_ = 0x3f800000;
          auVar214._8_4_ = 0xbf800000;
          auVar214._0_8_ = 0xbf800000bf800000;
          auVar214._12_4_ = 0xbf800000;
          auVar96 = vblendvps_avx(auVar167,auVar214,auVar96);
          fVar196 = auVar96._0_4_;
          if ((auVar190._0_4_ != fVar196) || (NAN(auVar190._0_4_) || NAN(fVar196))) {
            if ((fVar182 != fVar181) || (NAN(fVar182) || NAN(fVar181))) {
              fVar181 = -fVar181 / (fVar182 - fVar181);
              auVar96 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar181) * 0.0 + fVar181)));
            }
            else {
              auVar96 = ZEXT816(0x3f80000000000000);
              if ((fVar181 != 0.0) || (NAN(fVar181))) {
                auVar96 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar130 = vcmpps_avx(auVar166,auVar96,1);
            auVar190 = vblendps_avx(auVar166,auVar96,2);
            auVar96 = vblendps_avx(auVar96,auVar166,2);
            auVar166 = vblendvps_avx(auVar96,auVar190,auVar130);
          }
          if ((fVar198 != fVar196) || (NAN(fVar198) || NAN(fVar196))) {
            auVar97._8_4_ = 0x3f800000;
            auVar97._0_8_ = 0x3f8000003f800000;
            auVar97._12_4_ = 0x3f800000;
            auVar96 = vcmpps_avx(auVar166,auVar97,1);
            auVar190 = vinsertps_avx(auVar166,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar168._4_12_ = auVar166._4_12_;
            auVar168._0_4_ = 0x3f800000;
            auVar166 = vblendvps_avx(auVar168,auVar190,auVar96);
          }
          auVar96 = vcmpps_avx(auVar166,_DAT_01f7b6f0,1);
          auVar58._12_4_ = 0;
          auVar58._0_12_ = auVar166._4_12_;
          auVar190 = vinsertps_avx(auVar166,ZEXT416(0x3f800000),0x10);
          auVar96 = vblendvps_avx(auVar190,auVar58 << 0x20,auVar96);
          auVar190 = vmovshdup_avx(auVar96);
        } while (auVar190._0_4_ < auVar96._0_4_);
        auVar98._0_4_ = auVar96._0_4_ + -0.1;
        auVar98._4_4_ = auVar96._4_4_ + 0.1;
        auVar98._8_4_ = auVar96._8_4_ + 0.0;
        auVar98._12_4_ = auVar96._12_4_ + 0.0;
        auVar130 = vshufpd_avx(auVar238,auVar238,3);
        register0x00001388 = 0x3f80000000000000;
        local_418 = 0x3f80000000000000;
        auVar96 = vcmpps_avx(auVar98,_local_418,1);
        auVar57._12_4_ = 0;
        auVar57._0_12_ = auVar98._4_12_;
        auVar190 = vinsertps_avx(auVar98,SUB6416(ZEXT464(0x3f800000),0),0x10);
        auVar96 = vblendvps_avx(auVar190,auVar57 << 0x20,auVar96);
        auVar190 = vshufpd_avx(auVar19,auVar19,3);
        auVar166 = vshufps_avx(auVar96,auVar96,0x50);
        auVar255._8_4_ = 0x3f800000;
        auVar255._0_8_ = 0x3f8000003f800000;
        auVar255._12_4_ = 0x3f800000;
        auVar131 = vsubps_avx(auVar255,auVar166);
        local_308._0_4_ = auVar176._0_4_;
        local_308._4_4_ = auVar176._4_4_;
        fStack_300 = auVar176._8_4_;
        fStack_2fc = auVar176._12_4_;
        fVar181 = auVar166._0_4_;
        fVar182 = auVar166._4_4_;
        fVar196 = auVar166._8_4_;
        fVar197 = auVar166._12_4_;
        local_488._0_4_ = auVar141._0_4_;
        local_488._4_4_ = auVar141._4_4_;
        fStack_480 = auVar141._8_4_;
        fStack_47c = auVar141._12_4_;
        fVar198 = auVar131._0_4_;
        fVar199 = auVar131._4_4_;
        fVar224 = auVar131._8_4_;
        fVar225 = auVar131._12_4_;
        auVar99._0_4_ = fVar181 * (float)local_308._0_4_ + fVar198 * auVar254._0_4_;
        auVar99._4_4_ = fVar182 * (float)local_308._4_4_ + fVar199 * auVar254._4_4_;
        auVar99._8_4_ = fVar196 * fStack_300 + fVar224 * auVar254._0_4_;
        auVar99._12_4_ = fVar197 * fStack_2fc + fVar225 * auVar254._4_4_;
        auVar169._0_4_ = fVar181 * auVar130._0_4_ + fVar198 * auVar238._0_4_;
        auVar169._4_4_ = fVar182 * auVar130._4_4_ + fVar199 * auVar238._4_4_;
        auVar169._8_4_ = fVar196 * auVar130._8_4_ + fVar224 * auVar238._0_4_;
        auVar169._12_4_ = fVar197 * auVar130._12_4_ + fVar225 * auVar238._4_4_;
        auVar240._0_4_ = fVar181 * auVar190._0_4_ + fVar198 * fVar226;
        auVar240._4_4_ = fVar182 * auVar190._4_4_ + fVar199 * fVar228;
        auVar240._8_4_ = fVar196 * auVar190._8_4_ + fVar224 * fVar226;
        auVar240._12_4_ = fVar197 * auVar190._12_4_ + fVar225 * fVar228;
        auVar267._0_4_ = fVar181 * (float)local_488._0_4_ + fVar198 * auVar256._16_4_;
        auVar267._4_4_ = fVar182 * (float)local_488._4_4_ + fVar199 * auVar256._20_4_;
        auVar267._8_4_ = fVar196 * fStack_480 + fVar224 * auVar256._16_4_;
        auVar267._12_4_ = fVar197 * fStack_47c + fVar225 * auVar256._20_4_;
        auVar141 = vsubps_avx(auVar255,auVar96);
        auVar190 = vmovshdup_avx(auVar92);
        auVar176 = vmovsldup_avx(auVar92);
        auVar92._0_4_ = auVar176._0_4_ * auVar141._0_4_ + auVar96._0_4_ * auVar190._0_4_;
        auVar92._4_4_ = auVar176._4_4_ * auVar141._4_4_ + auVar96._4_4_ * auVar190._4_4_;
        auVar92._8_4_ = auVar176._8_4_ * auVar141._8_4_ + auVar96._8_4_ * auVar190._8_4_;
        auVar92._12_4_ = auVar176._12_4_ * auVar141._12_4_ + auVar96._12_4_ * auVar190._12_4_;
        _local_488 = vmovshdup_avx(auVar92);
        auVar96 = vsubps_avx(auVar169,auVar99);
        auVar193._0_4_ = auVar96._0_4_ * 3.0;
        auVar193._4_4_ = auVar96._4_4_ * 3.0;
        auVar193._8_4_ = auVar96._8_4_ * 3.0;
        auVar193._12_4_ = auVar96._12_4_ * 3.0;
        auVar96 = vsubps_avx(auVar240,auVar169);
        auVar284._0_4_ = auVar96._0_4_ * 3.0;
        auVar284._4_4_ = auVar96._4_4_ * 3.0;
        auVar284._8_4_ = auVar96._8_4_ * 3.0;
        auVar284._12_4_ = auVar96._12_4_ * 3.0;
        auVar96 = vsubps_avx(auVar267,auVar240);
        auVar291._0_4_ = auVar96._0_4_ * 3.0;
        auVar291._4_4_ = auVar96._4_4_ * 3.0;
        auVar291._8_4_ = auVar96._8_4_ * 3.0;
        auVar291._12_4_ = auVar96._12_4_ * 3.0;
        auVar190 = vminps_avx(auVar284,auVar291);
        auVar96 = vmaxps_avx(auVar284,auVar291);
        auVar190 = vminps_avx(auVar193,auVar190);
        auVar96 = vmaxps_avx(auVar193,auVar96);
        auVar176 = vshufpd_avx(auVar190,auVar190,3);
        auVar141 = vshufpd_avx(auVar96,auVar96,3);
        auVar190 = vminps_avx(auVar190,auVar176);
        auVar96 = vmaxps_avx(auVar96,auVar141);
        auVar176 = vshufps_avx(ZEXT416((uint)(1.0 / fVar150)),ZEXT416((uint)(1.0 / fVar150)),0);
        auVar285._0_4_ = auVar190._0_4_ * auVar176._0_4_;
        auVar285._4_4_ = auVar190._4_4_ * auVar176._4_4_;
        auVar285._8_4_ = auVar190._8_4_ * auVar176._8_4_;
        auVar285._12_4_ = auVar190._12_4_ * auVar176._12_4_;
        auVar292._0_4_ = auVar176._0_4_ * auVar96._0_4_;
        auVar292._4_4_ = auVar176._4_4_ * auVar96._4_4_;
        auVar292._8_4_ = auVar176._8_4_ * auVar96._8_4_;
        auVar292._12_4_ = auVar176._12_4_ * auVar96._12_4_;
        auVar131 = ZEXT416((uint)(1.0 / (local_488._0_4_ - auVar92._0_4_)));
        auVar96 = vshufpd_avx(auVar99,auVar99,3);
        auVar190 = vshufpd_avx(auVar169,auVar169,3);
        auVar176 = vshufpd_avx(auVar240,auVar240,3);
        auVar141 = vshufpd_avx(auVar267,auVar267,3);
        auVar96 = vsubps_avx(auVar96,auVar99);
        auVar130 = vsubps_avx(auVar190,auVar169);
        auVar166 = vsubps_avx(auVar176,auVar240);
        auVar141 = vsubps_avx(auVar141,auVar267);
        auVar190 = vminps_avx(auVar96,auVar130);
        auVar96 = vmaxps_avx(auVar96,auVar130);
        auVar176 = vminps_avx(auVar166,auVar141);
        auVar176 = vminps_avx(auVar190,auVar176);
        auVar190 = vmaxps_avx(auVar166,auVar141);
        auVar96 = vmaxps_avx(auVar96,auVar190);
        auVar190 = vshufps_avx(auVar131,auVar131,0);
        auVar332._0_4_ = auVar190._0_4_ * auVar176._0_4_;
        auVar332._4_4_ = auVar190._4_4_ * auVar176._4_4_;
        auVar332._8_4_ = auVar190._8_4_ * auVar176._8_4_;
        auVar332._12_4_ = auVar190._12_4_ * auVar176._12_4_;
        auVar341._0_4_ = auVar190._0_4_ * auVar96._0_4_;
        auVar341._4_4_ = auVar190._4_4_ * auVar96._4_4_;
        auVar341._8_4_ = auVar190._8_4_ * auVar96._8_4_;
        auVar341._12_4_ = auVar190._12_4_ * auVar96._12_4_;
        auVar96 = vmovsldup_avx(auVar92);
        auVar304._4_12_ = auVar96._4_12_;
        auVar304._0_4_ = fVar180;
        auVar310._4_12_ = auVar92._4_12_;
        auVar310._0_4_ = fVar270;
        auVar194._0_4_ = (fVar180 + fVar270) * 0.5;
        auVar194._4_4_ = (auVar96._4_4_ + auVar92._4_4_) * 0.5;
        auVar194._8_4_ = (auVar96._8_4_ + auVar92._8_4_) * 0.5;
        auVar194._12_4_ = (auVar96._12_4_ + auVar92._12_4_) * 0.5;
        auVar96 = vshufps_avx(auVar194,auVar194,0);
        fVar181 = auVar96._0_4_;
        fVar182 = auVar96._4_4_;
        fVar196 = auVar96._8_4_;
        fVar197 = auVar96._12_4_;
        auVar132._0_4_ = fVar181 * (float)local_1c8._0_4_ + (float)local_448._0_4_;
        auVar132._4_4_ = fVar182 * (float)local_1c8._4_4_ + (float)local_448._4_4_;
        auVar132._8_4_ = fVar196 * fStack_1c0 + fStack_440;
        auVar132._12_4_ = fVar197 * fStack_1bc + fStack_43c;
        auVar170._0_4_ = fVar181 * (float)local_1d8._0_4_ + (float)local_458._0_4_;
        auVar170._4_4_ = fVar182 * (float)local_1d8._4_4_ + (float)local_458._4_4_;
        auVar170._8_4_ = fVar196 * fStack_1d0 + fStack_450;
        auVar170._12_4_ = fVar197 * fStack_1cc + fStack_44c;
        auVar241._0_4_ = fVar181 * (float)local_1e8._0_4_ + (float)local_468._0_4_;
        auVar241._4_4_ = fVar182 * (float)local_1e8._4_4_ + (float)local_468._4_4_;
        auVar241._8_4_ = fVar196 * fStack_1e0 + fStack_460;
        auVar241._12_4_ = fVar197 * fStack_1dc + fStack_45c;
        auVar96 = vsubps_avx(auVar170,auVar132);
        auVar133._0_4_ = auVar132._0_4_ + fVar181 * auVar96._0_4_;
        auVar133._4_4_ = auVar132._4_4_ + fVar182 * auVar96._4_4_;
        auVar133._8_4_ = auVar132._8_4_ + fVar196 * auVar96._8_4_;
        auVar133._12_4_ = auVar132._12_4_ + fVar197 * auVar96._12_4_;
        auVar96 = vsubps_avx(auVar241,auVar170);
        auVar171._0_4_ = auVar170._0_4_ + fVar181 * auVar96._0_4_;
        auVar171._4_4_ = auVar170._4_4_ + fVar182 * auVar96._4_4_;
        auVar171._8_4_ = auVar170._8_4_ + fVar196 * auVar96._8_4_;
        auVar171._12_4_ = auVar170._12_4_ + fVar197 * auVar96._12_4_;
        auVar96 = vsubps_avx(auVar171,auVar133);
        fVar181 = auVar133._0_4_ + fVar181 * auVar96._0_4_;
        fVar182 = auVar133._4_4_ + fVar182 * auVar96._4_4_;
        auVar100._0_8_ = CONCAT44(fVar182,fVar181);
        auVar100._8_4_ = auVar133._8_4_ + fVar196 * auVar96._8_4_;
        auVar100._12_4_ = auVar133._12_4_ + fVar197 * auVar96._12_4_;
        fVar196 = auVar96._0_4_ * 3.0;
        fVar197 = auVar96._4_4_ * 3.0;
        auVar134._0_8_ = CONCAT44(fVar197,fVar196);
        auVar134._8_4_ = auVar96._8_4_ * 3.0;
        auVar134._12_4_ = auVar96._12_4_ * 3.0;
        auVar172._8_8_ = auVar100._0_8_;
        auVar172._0_8_ = auVar100._0_8_;
        auVar96 = vshufpd_avx(auVar100,auVar100,3);
        auVar190 = vshufps_avx(auVar194,auVar194,0x55);
        auVar166 = vsubps_avx(auVar96,auVar172);
        auVar325._0_4_ = auVar166._0_4_ * auVar190._0_4_ + fVar181;
        auVar325._4_4_ = auVar166._4_4_ * auVar190._4_4_ + fVar182;
        auVar325._8_4_ = auVar166._8_4_ * auVar190._8_4_ + fVar181;
        auVar325._12_4_ = auVar166._12_4_ * auVar190._12_4_ + fVar182;
        auVar173._8_8_ = auVar134._0_8_;
        auVar173._0_8_ = auVar134._0_8_;
        auVar96 = vshufpd_avx(auVar134,auVar134,1);
        auVar96 = vsubps_avx(auVar96,auVar173);
        auVar135._0_4_ = auVar96._0_4_ * auVar190._0_4_ + fVar196;
        auVar135._4_4_ = auVar96._4_4_ * auVar190._4_4_ + fVar197;
        auVar135._8_4_ = auVar96._8_4_ * auVar190._8_4_ + fVar196;
        auVar135._12_4_ = auVar96._12_4_ * auVar190._12_4_ + fVar197;
        auVar190 = vmovshdup_avx(auVar135);
        auVar242._0_8_ = auVar190._0_8_ ^ 0x8000000080000000;
        auVar242._8_4_ = auVar190._8_4_ ^ 0x80000000;
        auVar242._12_4_ = auVar190._12_4_ ^ 0x80000000;
        auVar176 = vmovshdup_avx(auVar166);
        auVar96 = vunpcklps_avx(auVar176,auVar242);
        auVar141 = vshufps_avx(auVar96,auVar242,4);
        auVar101._0_8_ = auVar166._0_8_ ^ 0x8000000080000000;
        auVar101._8_4_ = -auVar166._8_4_;
        auVar101._12_4_ = -auVar166._12_4_;
        auVar96 = vmovlhps_avx(auVar101,auVar135);
        auVar130 = vshufps_avx(auVar96,auVar135,8);
        auVar96 = ZEXT416((uint)(auVar135._0_4_ * auVar176._0_4_ - auVar166._0_4_ * auVar190._0_4_))
        ;
        auVar190 = vshufps_avx(auVar96,auVar96,0);
        auVar96 = vdivps_avx(auVar141,auVar190);
        auVar190 = vdivps_avx(auVar130,auVar190);
        auVar130 = vinsertps_avx(auVar285,auVar332,0x1c);
        auVar166 = vinsertps_avx(auVar292,auVar341,0x1c);
        auVar131 = vinsertps_avx(auVar332,auVar285,0x4c);
        auVar257 = vinsertps_avx(auVar341,auVar292,0x4c);
        auVar176 = vmovsldup_avx(auVar96);
        auVar293._0_4_ = auVar130._0_4_ * auVar176._0_4_;
        auVar293._4_4_ = auVar130._4_4_ * auVar176._4_4_;
        auVar293._8_4_ = auVar130._8_4_ * auVar176._8_4_;
        auVar293._12_4_ = auVar130._12_4_ * auVar176._12_4_;
        auVar136._0_4_ = auVar176._0_4_ * auVar166._0_4_;
        auVar136._4_4_ = auVar176._4_4_ * auVar166._4_4_;
        auVar136._8_4_ = auVar176._8_4_ * auVar166._8_4_;
        auVar136._12_4_ = auVar176._12_4_ * auVar166._12_4_;
        auVar141 = vminps_avx(auVar293,auVar136);
        auVar176 = vmaxps_avx(auVar136,auVar293);
        auVar18 = vmovsldup_avx(auVar190);
        auVar342._0_4_ = auVar18._0_4_ * auVar131._0_4_;
        auVar342._4_4_ = auVar18._4_4_ * auVar131._4_4_;
        auVar342._8_4_ = auVar18._8_4_ * auVar131._8_4_;
        auVar342._12_4_ = auVar18._12_4_ * auVar131._12_4_;
        auVar294._0_4_ = auVar18._0_4_ * auVar257._0_4_;
        auVar294._4_4_ = auVar18._4_4_ * auVar257._4_4_;
        auVar294._8_4_ = auVar18._8_4_ * auVar257._8_4_;
        auVar294._12_4_ = auVar18._12_4_ * auVar257._12_4_;
        auVar18 = vminps_avx(auVar342,auVar294);
        auVar215._0_4_ = auVar141._0_4_ + auVar18._0_4_;
        auVar215._4_4_ = auVar141._4_4_ + auVar18._4_4_;
        auVar215._8_4_ = auVar141._8_4_ + auVar18._8_4_;
        auVar215._12_4_ = auVar141._12_4_ + auVar18._12_4_;
        auVar141 = vmaxps_avx(auVar294,auVar342);
        auVar18 = vsubps_avx(auVar304,auVar194);
        auVar19 = vsubps_avx(auVar310,auVar194);
        auVar137._0_4_ = auVar141._0_4_ + auVar176._0_4_;
        auVar137._4_4_ = auVar141._4_4_ + auVar176._4_4_;
        auVar137._8_4_ = auVar141._8_4_ + auVar176._8_4_;
        auVar137._12_4_ = auVar141._12_4_ + auVar176._12_4_;
        auVar311._8_8_ = 0x3f800000;
        auVar311._0_8_ = 0x3f800000;
        auVar176 = vsubps_avx(auVar311,auVar137);
        auVar141 = vsubps_avx(auVar311,auVar215);
        fVar224 = auVar18._0_4_;
        auVar312._0_4_ = fVar224 * auVar176._0_4_;
        fVar225 = auVar18._4_4_;
        auVar312._4_4_ = fVar225 * auVar176._4_4_;
        fVar226 = auVar18._8_4_;
        auVar312._8_4_ = fVar226 * auVar176._8_4_;
        fVar228 = auVar18._12_4_;
        auVar312._12_4_ = fVar228 * auVar176._12_4_;
        fVar196 = auVar19._0_4_;
        auVar138._0_4_ = fVar196 * auVar176._0_4_;
        fVar197 = auVar19._4_4_;
        auVar138._4_4_ = fVar197 * auVar176._4_4_;
        fVar198 = auVar19._8_4_;
        auVar138._8_4_ = fVar198 * auVar176._8_4_;
        fVar199 = auVar19._12_4_;
        auVar138._12_4_ = fVar199 * auVar176._12_4_;
        auVar333._0_4_ = fVar224 * auVar141._0_4_;
        auVar333._4_4_ = fVar225 * auVar141._4_4_;
        auVar333._8_4_ = fVar226 * auVar141._8_4_;
        auVar333._12_4_ = fVar228 * auVar141._12_4_;
        auVar216._0_4_ = fVar196 * auVar141._0_4_;
        auVar216._4_4_ = fVar197 * auVar141._4_4_;
        auVar216._8_4_ = fVar198 * auVar141._8_4_;
        auVar216._12_4_ = fVar199 * auVar141._12_4_;
        auVar176 = vminps_avx(auVar312,auVar333);
        auVar141 = vminps_avx(auVar138,auVar216);
        auVar18 = vminps_avx(auVar176,auVar141);
        auVar176 = vmaxps_avx(auVar333,auVar312);
        auVar141 = vmaxps_avx(auVar216,auVar138);
        auVar19 = vshufps_avx(auVar194,auVar194,0x54);
        auVar141 = vmaxps_avx(auVar141,auVar176);
        auVar279 = vshufps_avx(auVar325,auVar325,0);
        auVar20 = vshufps_avx(auVar325,auVar325,0x55);
        auVar176 = vhaddps_avx(auVar18,auVar18);
        auVar141 = vhaddps_avx(auVar141,auVar141);
        auVar217._0_4_ = auVar20._0_4_ * auVar190._0_4_ + auVar279._0_4_ * auVar96._0_4_;
        auVar217._4_4_ = auVar20._4_4_ * auVar190._4_4_ + auVar279._4_4_ * auVar96._4_4_;
        auVar217._8_4_ = auVar20._8_4_ * auVar190._8_4_ + auVar279._8_4_ * auVar96._8_4_;
        auVar217._12_4_ = auVar20._12_4_ * auVar190._12_4_ + auVar279._12_4_ * auVar96._12_4_;
        auVar18 = vsubps_avx(auVar19,auVar217);
        fVar181 = auVar18._0_4_ + auVar176._0_4_;
        fVar182 = auVar18._0_4_ + auVar141._0_4_;
        auVar176 = vmaxss_avx(ZEXT416((uint)fVar180),ZEXT416((uint)fVar181));
        auVar141 = vminss_avx(ZEXT416((uint)fVar182),ZEXT416((uint)fVar270));
      } while (auVar141._0_4_ < auVar176._0_4_);
      auVar176 = vmovshdup_avx(auVar96);
      auVar218._0_4_ = auVar130._0_4_ * auVar176._0_4_;
      auVar218._4_4_ = auVar130._4_4_ * auVar176._4_4_;
      auVar218._8_4_ = auVar130._8_4_ * auVar176._8_4_;
      auVar218._12_4_ = auVar130._12_4_ * auVar176._12_4_;
      auVar139._0_4_ = auVar176._0_4_ * auVar166._0_4_;
      auVar139._4_4_ = auVar176._4_4_ * auVar166._4_4_;
      auVar139._8_4_ = auVar176._8_4_ * auVar166._8_4_;
      auVar139._12_4_ = auVar176._12_4_ * auVar166._12_4_;
      auVar141 = vminps_avx(auVar218,auVar139);
      auVar176 = vmaxps_avx(auVar139,auVar218);
      auVar130 = vmovshdup_avx(auVar190);
      auVar102._0_4_ = auVar130._0_4_ * auVar131._0_4_;
      auVar102._4_4_ = auVar130._4_4_ * auVar131._4_4_;
      auVar102._8_4_ = auVar130._8_4_ * auVar131._8_4_;
      auVar102._12_4_ = auVar130._12_4_ * auVar131._12_4_;
      auVar219._0_4_ = auVar257._0_4_ * auVar130._0_4_;
      auVar219._4_4_ = auVar257._4_4_ * auVar130._4_4_;
      auVar219._8_4_ = auVar257._8_4_ * auVar130._8_4_;
      auVar219._12_4_ = auVar257._12_4_ * auVar130._12_4_;
      auVar130 = vminps_avx(auVar102,auVar219);
      auVar174._0_4_ = auVar141._0_4_ + auVar130._0_4_;
      auVar174._4_4_ = auVar141._4_4_ + auVar130._4_4_;
      auVar174._8_4_ = auVar141._8_4_ + auVar130._8_4_;
      auVar174._12_4_ = auVar141._12_4_ + auVar130._12_4_;
      auVar141 = vmaxps_avx(auVar219,auVar102);
      auVar103._0_4_ = auVar176._0_4_ + auVar141._0_4_;
      auVar103._4_4_ = auVar176._4_4_ + auVar141._4_4_;
      auVar103._8_4_ = auVar176._8_4_ + auVar141._8_4_;
      auVar103._12_4_ = auVar176._12_4_ + auVar141._12_4_;
      auVar176 = vsubps_avx(_local_418,auVar103);
      auVar141 = vsubps_avx(_local_418,auVar174);
      auVar175._0_4_ = fVar224 * auVar176._0_4_;
      auVar175._4_4_ = fVar225 * auVar176._4_4_;
      auVar175._8_4_ = fVar226 * auVar176._8_4_;
      auVar175._12_4_ = fVar228 * auVar176._12_4_;
      auVar220._0_4_ = fVar224 * auVar141._0_4_;
      auVar220._4_4_ = fVar225 * auVar141._4_4_;
      auVar220._8_4_ = fVar226 * auVar141._8_4_;
      auVar220._12_4_ = fVar228 * auVar141._12_4_;
      auVar104._0_4_ = fVar196 * auVar176._0_4_;
      auVar104._4_4_ = fVar197 * auVar176._4_4_;
      auVar104._8_4_ = fVar198 * auVar176._8_4_;
      auVar104._12_4_ = fVar199 * auVar176._12_4_;
      auVar140._0_4_ = fVar196 * auVar141._0_4_;
      auVar140._4_4_ = fVar197 * auVar141._4_4_;
      auVar140._8_4_ = fVar198 * auVar141._8_4_;
      auVar140._12_4_ = fVar199 * auVar141._12_4_;
      auVar176 = vminps_avx(auVar175,auVar220);
      auVar141 = vminps_avx(auVar104,auVar140);
      auVar176 = vminps_avx(auVar176,auVar141);
      auVar141 = vmaxps_avx(auVar220,auVar175);
      auVar130 = vmaxps_avx(auVar140,auVar104);
      auVar176 = vhaddps_avx(auVar176,auVar176);
      auVar141 = vmaxps_avx(auVar130,auVar141);
      auVar141 = vhaddps_avx(auVar141,auVar141);
      auVar130 = vmovshdup_avx(auVar18);
      auVar166 = ZEXT416((uint)(auVar130._0_4_ + auVar176._0_4_));
      auVar176 = vmaxss_avx(auVar92,auVar166);
      auVar130 = ZEXT416((uint)(auVar130._0_4_ + auVar141._0_4_));
      auVar141 = vminss_avx(auVar130,_local_488);
      auVar343._8_4_ = 0x7fffffff;
      auVar343._0_8_ = 0x7fffffff7fffffff;
      auVar343._12_4_ = 0x7fffffff;
    } while (auVar141._0_4_ < auVar176._0_4_);
    uVar72 = 0;
    if ((fVar180 < fVar181) && (fVar182 < fVar270)) {
      auVar176 = vcmpps_avx(auVar130,_local_488,1);
      auVar141 = vcmpps_avx(auVar92,auVar166,1);
      auVar176 = vandps_avx(auVar141,auVar176);
      uVar72 = auVar176._0_4_;
    }
    if ((3 < (uint)uVar66 || fVar150 < 0.001) || (uVar72 & 1) != 0) {
      lVar67 = 200;
      do {
        fVar150 = auVar18._0_4_;
        fVar270 = 1.0 - fVar150;
        auVar176 = ZEXT416((uint)(fVar270 * fVar270 * fVar270));
        auVar176 = vshufps_avx(auVar176,auVar176,0);
        auVar141 = ZEXT416((uint)(fVar150 * 3.0 * fVar270 * fVar270));
        auVar141 = vshufps_avx(auVar141,auVar141,0);
        auVar130 = ZEXT416((uint)(fVar270 * fVar150 * fVar150 * 3.0));
        auVar130 = vshufps_avx(auVar130,auVar130,0);
        auVar166 = ZEXT416((uint)(fVar150 * fVar150 * fVar150));
        auVar166 = vshufps_avx(auVar166,auVar166,0);
        fVar270 = (float)local_448._0_4_ * auVar176._0_4_ +
                  (float)local_458._0_4_ * auVar141._0_4_ +
                  (float)local_298._0_4_ * auVar166._0_4_ + (float)local_468._0_4_ * auVar130._0_4_;
        fVar150 = (float)local_448._4_4_ * auVar176._4_4_ +
                  (float)local_458._4_4_ * auVar141._4_4_ +
                  (float)local_298._4_4_ * auVar166._4_4_ + (float)local_468._4_4_ * auVar130._4_4_;
        auVar105._0_8_ = CONCAT44(fVar150,fVar270);
        auVar105._8_4_ =
             fStack_440 * auVar176._8_4_ +
             fStack_450 * auVar141._8_4_ + fStack_290 * auVar166._8_4_ + fStack_460 * auVar130._8_4_
        ;
        auVar105._12_4_ =
             fStack_43c * auVar176._12_4_ +
             fStack_44c * auVar141._12_4_ +
             fStack_28c * auVar166._12_4_ + fStack_45c * auVar130._12_4_;
        auVar142._8_8_ = auVar105._0_8_;
        auVar142._0_8_ = auVar105._0_8_;
        auVar141 = vshufpd_avx(auVar105,auVar105,1);
        auVar176 = vmovshdup_avx(auVar18);
        auVar141 = vsubps_avx(auVar141,auVar142);
        auVar106._0_4_ = auVar176._0_4_ * auVar141._0_4_ + fVar270;
        auVar106._4_4_ = auVar176._4_4_ * auVar141._4_4_ + fVar150;
        auVar106._8_4_ = auVar176._8_4_ * auVar141._8_4_ + fVar270;
        auVar106._12_4_ = auVar176._12_4_ * auVar141._12_4_ + fVar150;
        auVar176 = vshufps_avx(auVar106,auVar106,0);
        auVar141 = vshufps_avx(auVar106,auVar106,0x55);
        auVar143._0_4_ = auVar96._0_4_ * auVar176._0_4_ + auVar190._0_4_ * auVar141._0_4_;
        auVar143._4_4_ = auVar96._4_4_ * auVar176._4_4_ + auVar190._4_4_ * auVar141._4_4_;
        auVar143._8_4_ = auVar96._8_4_ * auVar176._8_4_ + auVar190._8_4_ * auVar141._8_4_;
        auVar143._12_4_ = auVar96._12_4_ * auVar176._12_4_ + auVar190._12_4_ * auVar141._12_4_;
        auVar18 = vsubps_avx(auVar18,auVar143);
        auVar176 = vandps_avx(auVar343,auVar106);
        auVar141 = vshufps_avx(auVar176,auVar176,0xf5);
        auVar176 = vmaxss_avx(auVar141,auVar176);
        if (auVar176._0_4_ < (float)local_2a8._0_4_) {
          fVar270 = auVar18._0_4_;
          if ((0.0 <= fVar270) && (fVar270 <= 1.0)) {
            auVar96 = vmovshdup_avx(auVar18);
            fVar150 = auVar96._0_4_;
            if ((0.0 <= fVar150) && (fVar150 <= 1.0)) {
              auVar96 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                                      ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),0x1c);
              auVar257 = vinsertps_avx(auVar96,ZEXT416((uint)(pre->ray_space).vz.field_0.m128[2]),
                                       0x28);
              aVar10 = (ray->org).field_0;
              auVar96 = vsubps_avx(_local_378,(undefined1  [16])aVar10);
              auVar96 = vdpps_avx(auVar96,auVar257,0x7f);
              auVar190 = vsubps_avx(_local_388,(undefined1  [16])aVar10);
              auVar190 = vdpps_avx(auVar190,auVar257,0x7f);
              auVar176 = vsubps_avx(_local_398,(undefined1  [16])aVar10);
              auVar176 = vdpps_avx(auVar176,auVar257,0x7f);
              auVar141 = vsubps_avx(_local_3a8,(undefined1  [16])aVar10);
              auVar141 = vdpps_avx(auVar141,auVar257,0x7f);
              auVar130 = vsubps_avx(_local_3b8,(undefined1  [16])aVar10);
              auVar130 = vdpps_avx(auVar130,auVar257,0x7f);
              auVar166 = vsubps_avx(_local_3c8,(undefined1  [16])aVar10);
              auVar166 = vdpps_avx(auVar166,auVar257,0x7f);
              auVar63._4_4_ = fStack_3d4;
              auVar63._0_4_ = local_3d8;
              auVar63._8_4_ = fStack_3d0;
              auVar63._12_4_ = fStack_3cc;
              auVar131 = vsubps_avx(auVar63,(undefined1  [16])aVar10);
              auVar131 = vdpps_avx(auVar131,auVar257,0x7f);
              auVar61._4_4_ = fStack_424;
              auVar61._0_4_ = local_428;
              auVar61._8_4_ = fStack_420;
              auVar61._12_4_ = fStack_41c;
              auVar19 = vsubps_avx(auVar61,(undefined1  [16])aVar10);
              auVar257 = vdpps_avx(auVar19,auVar257,0x7f);
              fVar197 = 1.0 - fVar150;
              fVar198 = 1.0 - fVar270;
              fVar180 = auVar18._4_4_;
              fVar181 = auVar18._8_4_;
              fVar182 = auVar18._12_4_;
              fVar196 = fVar198 * fVar270 * fVar270 * 3.0;
              auVar243._0_4_ = fVar270 * fVar270 * fVar270;
              auVar243._4_4_ = fVar180 * fVar180 * fVar180;
              auVar243._8_4_ = fVar181 * fVar181 * fVar181;
              auVar243._12_4_ = fVar182 * fVar182 * fVar182;
              fVar180 = fVar270 * 3.0 * fVar198 * fVar198;
              fVar181 = fVar198 * fVar198 * fVar198;
              fVar270 = (fVar197 * auVar96._0_4_ + auVar130._0_4_ * fVar150) * fVar181 +
                        fVar180 * (auVar166._0_4_ * fVar150 + fVar197 * auVar190._0_4_) +
                        fVar196 * (auVar131._0_4_ * fVar150 + fVar197 * auVar176._0_4_) +
                        auVar243._0_4_ * (fVar197 * auVar141._0_4_ + fVar150 * auVar257._0_4_);
              if (((ray->org).field_0.m128[3] <= fVar270) &&
                 (fVar150 = ray->tfar, fVar270 <= fVar150)) {
                pGVar12 = (context->scene->geometries).items[local_430].ptr;
                if ((pGVar12->mask & ray->mask) == 0) {
LAB_00f24f22:
                  bVar64 = 0;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar64 = 1, pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  auVar96 = vshufps_avx(auVar18,auVar18,0x55);
                  auVar286._8_4_ = 0x3f800000;
                  auVar286._0_8_ = 0x3f8000003f800000;
                  auVar286._12_4_ = 0x3f800000;
                  auVar190 = vsubps_avx(auVar286,auVar96);
                  fVar182 = auVar96._0_4_;
                  fVar197 = auVar96._4_4_;
                  fVar199 = auVar96._8_4_;
                  fVar224 = auVar96._12_4_;
                  fVar225 = auVar190._0_4_;
                  fVar226 = auVar190._4_4_;
                  fVar228 = auVar190._8_4_;
                  fVar246 = auVar190._12_4_;
                  auVar295._0_4_ =
                       fVar182 * (float)local_3b8._0_4_ + fVar225 * (float)local_378._0_4_;
                  auVar295._4_4_ =
                       fVar197 * (float)local_3b8._4_4_ + fVar226 * (float)local_378._4_4_;
                  auVar295._8_4_ = fVar199 * fStack_3b0 + fVar228 * fStack_370;
                  auVar295._12_4_ = fVar224 * fStack_3ac + fVar246 * fStack_36c;
                  auVar305._0_4_ =
                       fVar182 * (float)local_3c8._0_4_ + fVar225 * (float)local_388._0_4_;
                  auVar305._4_4_ =
                       fVar197 * (float)local_3c8._4_4_ + fVar226 * (float)local_388._4_4_;
                  auVar305._8_4_ = fVar199 * fStack_3c0 + fVar228 * fStack_380;
                  auVar305._12_4_ = fVar224 * fStack_3bc + fVar246 * fStack_37c;
                  auVar313._0_4_ = fVar182 * local_3d8 + fVar225 * (float)local_398._0_4_;
                  auVar313._4_4_ = fVar197 * fStack_3d4 + fVar226 * (float)local_398._4_4_;
                  auVar313._8_4_ = fVar199 * fStack_3d0 + fVar228 * fStack_390;
                  auVar313._12_4_ = fVar224 * fStack_3cc + fVar246 * fStack_38c;
                  auVar268._0_4_ = fVar225 * (float)local_3a8._0_4_ + fVar182 * local_428;
                  auVar268._4_4_ = fVar226 * (float)local_3a8._4_4_ + fVar197 * fStack_424;
                  auVar268._8_4_ = fVar228 * fStack_3a0 + fVar199 * fStack_420;
                  auVar268._12_4_ = fVar246 * fStack_39c + fVar224 * fStack_41c;
                  auVar141 = vsubps_avx(auVar305,auVar295);
                  auVar130 = vsubps_avx(auVar313,auVar305);
                  auVar166 = vsubps_avx(auVar268,auVar313);
                  auVar96 = vshufps_avx(auVar18,auVar18,0);
                  fVar224 = auVar96._0_4_;
                  fVar225 = auVar96._4_4_;
                  fVar226 = auVar96._8_4_;
                  fVar228 = auVar96._12_4_;
                  auVar96 = vshufps_avx(ZEXT416((uint)fVar198),ZEXT416((uint)fVar198),0);
                  fVar182 = auVar96._0_4_;
                  fVar197 = auVar96._4_4_;
                  fVar198 = auVar96._8_4_;
                  fVar199 = auVar96._12_4_;
                  auVar96 = vshufps_avx(auVar243,auVar243,0);
                  auVar190 = vshufps_avx(ZEXT416((uint)fVar196),ZEXT416((uint)fVar196),0);
                  auVar176 = vshufps_avx(ZEXT416((uint)fVar180),ZEXT416((uint)fVar180),0);
                  auVar221._0_4_ =
                       ((auVar141._0_4_ * fVar182 + fVar224 * auVar130._0_4_) * fVar182 +
                       fVar224 * (auVar130._0_4_ * fVar182 + fVar224 * auVar166._0_4_)) * 3.0;
                  auVar221._4_4_ =
                       ((auVar141._4_4_ * fVar197 + fVar225 * auVar130._4_4_) * fVar197 +
                       fVar225 * (auVar130._4_4_ * fVar197 + fVar225 * auVar166._4_4_)) * 3.0;
                  auVar221._8_4_ =
                       ((auVar141._8_4_ * fVar198 + fVar226 * auVar130._8_4_) * fVar198 +
                       fVar226 * (auVar130._8_4_ * fVar198 + fVar226 * auVar166._8_4_)) * 3.0;
                  auVar221._12_4_ =
                       ((auVar141._12_4_ * fVar199 + fVar228 * auVar130._12_4_) * fVar199 +
                       fVar228 * (auVar130._12_4_ * fVar199 + fVar228 * auVar166._12_4_)) * 3.0;
                  auVar141 = vshufps_avx(ZEXT416((uint)fVar181),ZEXT416((uint)fVar181),0);
                  auVar144._0_4_ =
                       auVar141._0_4_ * (float)local_218._0_4_ +
                       auVar176._0_4_ * (float)local_228._0_4_ +
                       auVar96._0_4_ * (float)local_248._0_4_ +
                       auVar190._0_4_ * (float)local_238._0_4_;
                  auVar144._4_4_ =
                       auVar141._4_4_ * (float)local_218._4_4_ +
                       auVar176._4_4_ * (float)local_228._4_4_ +
                       auVar96._4_4_ * (float)local_248._4_4_ +
                       auVar190._4_4_ * (float)local_238._4_4_;
                  auVar144._8_4_ =
                       auVar141._8_4_ * fStack_210 +
                       auVar176._8_4_ * fStack_220 +
                       auVar96._8_4_ * fStack_240 + auVar190._8_4_ * fStack_230;
                  auVar144._12_4_ =
                       auVar141._12_4_ * fStack_20c +
                       auVar176._12_4_ * fStack_21c +
                       auVar96._12_4_ * fStack_23c + auVar190._12_4_ * fStack_22c;
                  auVar96 = vshufps_avx(auVar221,auVar221,0xc9);
                  auVar177._0_4_ = auVar144._0_4_ * auVar96._0_4_;
                  auVar177._4_4_ = auVar144._4_4_ * auVar96._4_4_;
                  auVar177._8_4_ = auVar144._8_4_ * auVar96._8_4_;
                  auVar177._12_4_ = auVar144._12_4_ * auVar96._12_4_;
                  auVar96 = vshufps_avx(auVar144,auVar144,0xc9);
                  auVar145._0_4_ = auVar221._0_4_ * auVar96._0_4_;
                  auVar145._4_4_ = auVar221._4_4_ * auVar96._4_4_;
                  auVar145._8_4_ = auVar221._8_4_ * auVar96._8_4_;
                  auVar145._12_4_ = auVar221._12_4_ * auVar96._12_4_;
                  auVar190 = vsubps_avx(auVar145,auVar177);
                  auVar96 = vshufps_avx(auVar190,auVar190,0xe9);
                  local_278 = vmovlps_avx(auVar96);
                  local_270 = auVar190._0_4_;
                  local_26c = vmovlps_avx(auVar18);
                  local_264 = (int)local_2e8;
                  local_260 = (int)local_430;
                  local_25c = context->user->instID[0];
                  local_258 = context->user->instPrimID[0];
                  ray->tfar = fVar270;
                  local_4bc = -1;
                  local_2d8.valid = &local_4bc;
                  local_2d8.geometryUserPtr = pGVar12->userPtr;
                  local_2d8.context = context->user;
                  local_2d8.hit = (RTCHitN *)&local_278;
                  local_2d8.N = 1;
                  local_2d8.ray = (RTCRayN *)ray;
                  if (pGVar12->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00f24ece:
                    p_Var17 = context->args->filter;
                    if ((p_Var17 == (RTCFilterFunctionN)0x0) ||
                       ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT &&
                         (((pGVar12->field_8).field_0x2 & 0x40) == 0)) ||
                        ((*p_Var17)(&local_2d8), *local_2d8.valid != 0)))) {
                      bVar64 = 1;
                      goto LAB_00f24f24;
                    }
                  }
                  else {
                    _local_4b8 = ZEXT832((ulong)auVar73);
                    (*pGVar12->occlusionFilterN)(&local_2d8);
                    auVar73 = local_4b8;
                    if (*local_2d8.valid != 0) goto LAB_00f24ece;
                  }
                  ray->tfar = fVar150;
                  goto LAB_00f24f22;
                }
LAB_00f24f24:
                bVar71 = (bool)(bVar71 | bVar64);
              }
            }
          }
          break;
        }
        lVar67 = lVar67 + -1;
      } while (lVar67 != 0);
      goto LAB_00f2404d;
    }
    auVar96 = vinsertps_avx(ZEXT416((uint)fVar180),ZEXT416((uint)fVar270),0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray.org, primID,ray.time());

          if (Intersector().intersect(pre,ray,context,geom,primID,curve,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }